

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellABecLap.cpp
# Opt level: O0

void __thiscall
amrex::MLCellABecLap::applyInhomogNeumannTerm(MLCellABecLap *this,int amrlev,Any *a_rhs)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  Geometry *pGVar4;
  const_reference ppMVar5;
  IntVect *pIVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  const_reference pvVar9;
  long lVar10;
  undefined4 in_ESI;
  long *in_RDI;
  IntVect IVar11;
  Real A_5;
  int i_13;
  int j_13;
  int k_13;
  Dim3 amrex_i_hi_13;
  Dim3 amrex_i_lo_13;
  Real fac_11;
  Real A_4;
  int i_12;
  int j_12;
  int k_12;
  Dim3 amrex_i_hi_12;
  Dim3 amrex_i_lo_12;
  Real fac_10;
  Real A_3;
  int i_11;
  int j_11;
  int k_11;
  Dim3 amrex_i_hi_11;
  Dim3 amrex_i_lo_11;
  Real fac_9;
  Real A_2;
  int i_10;
  int j_10;
  int k_10;
  Dim3 amrex_i_hi_10;
  Dim3 amrex_i_lo_10;
  Real fac_8;
  Real A_1;
  int i_9;
  int j_9;
  int k_9;
  Dim3 amrex_i_hi_9;
  Dim3 amrex_i_lo_9;
  Real fac_7;
  Real A;
  int i_8;
  int j_8;
  int k_8;
  Dim3 amrex_i_hi_8;
  Dim3 amrex_i_lo_8;
  Real fac_6;
  Array4<const_double> *rbc;
  int i_7;
  int j_7;
  int k_7;
  Dim3 amrex_i_hi_7;
  Dim3 amrex_i_lo_7;
  Real fac_5;
  int i_6;
  int j_6;
  int k_6;
  Dim3 amrex_i_hi_6;
  Dim3 amrex_i_lo_6;
  int i_5;
  int j_5;
  int k_5;
  Dim3 amrex_i_hi_5;
  Dim3 amrex_i_lo_5;
  Real fac_4;
  int i_4;
  int j_4;
  int k_4;
  Dim3 amrex_i_hi_4;
  Dim3 amrex_i_lo_4;
  Real fac_3;
  int i_3;
  int j_3;
  int k_3;
  Dim3 amrex_i_hi_3;
  Dim3 amrex_i_lo_3;
  Real fac_2;
  int i_2;
  int j_2;
  int k_2;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  int i_1;
  int j_1;
  int k_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  Real fac_1;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Real fac;
  Real bclhi;
  Real bcllo;
  BoundCond bcthi;
  BoundCond bctlo;
  int icomp;
  bool outside_domain_hi;
  bool outside_domain_lo;
  Array4<const_double> *bvhi;
  Array4<const_double> *bvlo;
  Array4<const_int> *mhi;
  Array4<const_int> *mlo;
  Box bhi;
  Box blo;
  Orientation ohi;
  Orientation olo;
  Array4<const_double> bfab;
  int idim;
  Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
  *bdcv;
  Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_> *bdlv;
  Array4<double> *rhsfab;
  Box *vbx;
  MFIter mfi;
  MFItInfo mfi_info;
  MLMGBndry *bndry;
  BndryCondLoc *bcondloc;
  array<amrex::MultiMask,_6UL> *maskvals;
  bool has_bcoef;
  FArrayBox foo;
  Array<const_MultiFab_*,_3> *bcoef;
  Real beta;
  Box *domain;
  Real dx;
  Real xlo;
  Real dzi;
  Real dyi;
  Real dxi;
  GpuArray<double,_3U> probhi;
  GpuArray<double,_3U> problo;
  int mglev;
  int ncomp;
  MultiFab *rhs;
  bool has_robin;
  bool has_inhomog_neumann;
  IndexType typ;
  int sm;
  IntVect hi;
  IntVect low;
  IndexType typ_1;
  int bg;
  uint bitval;
  IntVect hi_1;
  IntVect low_1;
  Real b;
  Real b_1;
  Real b_2;
  Real b_3;
  Real b_4;
  Real b_5;
  Real b_6;
  Real b_7;
  BndryData *in_stack_ffffffffffffe058;
  BndryCondLoc *in_stack_ffffffffffffe060;
  MLLinOp *in_stack_ffffffffffffe068;
  Geometry *in_stack_ffffffffffffe070;
  Box *in_stack_ffffffffffffe078;
  MFItInfo *in_stack_ffffffffffffe080;
  FabArrayBase *in_stack_ffffffffffffe088;
  MFIter *in_stack_ffffffffffffe090;
  int local_1eb4;
  int local_1eb0;
  int local_1eac;
  int local_1e54;
  int local_1e50;
  int local_1e4c;
  int local_1df4;
  int local_1df0;
  int local_1dec;
  int local_1d94;
  int local_1d90;
  int local_1d8c;
  int local_1d34;
  int local_1d30;
  int local_1d2c;
  int local_1cd4;
  int local_1cd0;
  int local_1ccc;
  Array4<const_double> local_1c80;
  Array4<const_double> *local_1c40;
  int local_1c38;
  int local_1c34;
  int local_1c30;
  int local_1c2c;
  undefined8 local_1c14;
  int local_1c0c;
  int local_1bf8;
  int iStack_1bf4;
  double local_1be8;
  int local_1be0;
  int local_1bdc;
  int local_1bd8;
  int local_1bd4;
  undefined8 local_1bbc;
  int local_1bb4;
  int local_1ba0;
  int iStack_1b9c;
  int local_1b90;
  int local_1b8c;
  int local_1b88;
  int local_1b84;
  undefined8 local_1b6c;
  int local_1b64;
  int local_1b50;
  int iStack_1b4c;
  double local_1b40;
  int local_1b38;
  int local_1b34;
  int local_1b30;
  int local_1b2c;
  undefined8 local_1b14;
  int local_1b0c;
  int local_1af8;
  int iStack_1af4;
  double local_1ae8;
  int local_1ae0;
  int local_1adc;
  int local_1ad8;
  int local_1ad4;
  undefined8 local_1abc;
  int local_1ab4;
  int local_1aa0;
  int iStack_1a9c;
  double local_1a90;
  int local_1a88;
  int local_1a84;
  int local_1a80;
  int local_1a7c;
  undefined8 local_1a64;
  int local_1a5c;
  int local_1a48;
  int iStack_1a44;
  int local_1a38;
  int local_1a34;
  int local_1a30;
  int local_1a2c;
  undefined8 local_1a14;
  int local_1a0c;
  int local_19f8;
  int iStack_19f4;
  double local_19e8;
  int local_19e0;
  int local_19dc;
  int local_19d8;
  int local_19d4;
  undefined8 local_19bc;
  int local_19b4;
  int local_19a0;
  int iStack_199c;
  double local_1990;
  value_type_conflict1 local_1988;
  value_type_conflict1 local_1980;
  int local_1974;
  int local_1970;
  int local_196c;
  byte local_1966;
  byte local_1965;
  int local_1964;
  long local_1960 [8];
  long *local_1920;
  int local_1914;
  long local_1910 [8];
  long *local_18d0;
  long local_18c8 [8];
  long *local_1888;
  long local_1880 [8];
  long *local_1840;
  Box local_1838;
  Box local_181c;
  Orientation local_1800;
  Orientation local_17fc;
  Array4<const_double> local_17f8;
  uint local_17b4;
  Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
  *local_17b0;
  Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_> *local_17a8;
  long local_17a0 [8];
  long *local_1760;
  Box local_1754;
  Box *local_1738;
  MFIter local_1730;
  MFItInfo local_16cc;
  type local_16b8;
  type local_16a0;
  array<amrex::MultiMask,_6UL> *local_1698;
  byte local_168d;
  IntVect local_168c;
  IntVect local_1680 [3];
  undefined1 local_1658 [16];
  double *local_1648;
  undefined1 auStack_1640 [12];
  int iStack_1634;
  int local_1630;
  int iStack_162c;
  int local_1624;
  undefined1 local_1610 [24];
  undefined1 *local_15f8;
  double local_15f0;
  Box *local_15e8;
  Real local_15e0;
  double local_15d8;
  Real local_15d0;
  Real local_15c8;
  Real local_15c0;
  undefined1 local_15b8 [24];
  double local_15a0 [3];
  undefined4 local_1588;
  int local_1584;
  MultiFab *local_1580;
  byte local_1572;
  byte local_1571;
  undefined4 local_1564;
  Box *local_1548;
  Box *local_1520;
  Box *local_14f8;
  Box *local_14d0;
  Box *local_14a8;
  Box *local_1480;
  Box *local_1458;
  Box *local_1430;
  Box *local_1408;
  Box *local_13e0;
  Box *local_13b8;
  Box *local_1390;
  Box *local_1368;
  Box *local_1340;
  Box *local_1318;
  Box *local_12f0;
  Box *local_12c8;
  Box *local_12a0;
  Box *local_1278;
  Box *local_1250;
  Box *local_1228;
  Box *local_1200;
  Box *local_11d8;
  Box *local_11b0;
  Box *local_1188;
  Box *local_1160;
  Box *local_1138;
  Box *local_1110;
  undefined1 *local_10f8;
  undefined4 local_10ec;
  double *local_10e8;
  undefined1 *local_10e0;
  uint local_10d4;
  uint local_10d0;
  int local_10cc;
  IntVect local_10c8;
  IntVect local_10b8;
  int local_10a8;
  uint local_10a4;
  Box *local_10a0;
  uint local_1094;
  uint local_1090;
  int local_108c;
  int local_1088 [3];
  undefined8 local_1078;
  int local_1070;
  uint local_106c;
  IntVect local_1068;
  IntVect local_1058;
  int local_1048;
  uint local_1044;
  Box *local_1040;
  double local_1038;
  int local_1030;
  byte local_1029;
  double local_1028;
  long *local_1020;
  value_type_conflict1 local_1018;
  Array4<const_double> *local_1010;
  long *local_1008;
  long *local_1000;
  int local_ff8;
  int local_ff4;
  int local_ff0;
  BoundCond local_fec;
  double local_fe8;
  int local_fdc;
  Real local_fd8;
  double local_fd0;
  double local_fc8;
  long *local_fc0;
  value_type_conflict1 local_fb8;
  long *local_fb0;
  long *local_fa8;
  int local_fa0;
  int local_f9c;
  int local_f98;
  BoundCond local_f94;
  double local_f90;
  int local_f88;
  byte local_f81;
  double local_f80;
  long *local_f78;
  value_type_conflict1 local_f70;
  Array4<const_double> *local_f68;
  long *local_f60;
  long *local_f58;
  int local_f50;
  int local_f4c;
  int local_f48;
  BoundCond local_f44;
  double local_f40;
  int local_f38;
  byte local_f31;
  double local_f30;
  long *local_f28;
  value_type_conflict1 local_f20;
  Array4<const_double> *local_f18;
  long *local_f10;
  long *local_f08;
  int local_f00;
  int local_efc;
  int local_ef8;
  BoundCond local_ef4;
  Box *local_ef0;
  int local_ee8;
  byte local_ee1;
  double local_ee0;
  long *local_ed8;
  value_type_conflict1 local_ed0;
  Array4<const_double> *local_ec8;
  long *local_ec0;
  long *local_eb8;
  int local_eb0;
  int local_eac;
  int local_ea8;
  BoundCond local_ea4;
  double local_ea0;
  int local_e94;
  Real local_e90;
  double local_e88;
  double local_e80;
  long *local_e78;
  value_type_conflict1 local_e70;
  long *local_e68;
  long *local_e60;
  int local_e58;
  int local_e54;
  int local_e50;
  BoundCond local_e4c;
  Geometry *local_e48;
  int local_e40;
  byte local_e39;
  double local_e38;
  long *local_e30;
  value_type_conflict1 local_e28;
  Array4<const_double> *local_e20;
  long *local_e18;
  long *local_e10;
  int local_e08;
  int local_e04;
  int local_e00;
  BoundCond local_dfc;
  MLLinOp *local_df8;
  int local_df0;
  byte local_de9;
  double local_de8;
  long *local_de0;
  value_type_conflict1 local_dd8;
  Array4<const_double> *local_dd0;
  long *local_dc8;
  long *local_dc0;
  int local_db8;
  int local_db4;
  int local_db0;
  BoundCond local_dac;
  Array4<const_double> local_da8;
  int local_d64;
  FArrayBox *local_d60;
  int local_d58;
  int local_d54;
  int local_d50;
  int local_d4c;
  Array4<const_double> *local_d48;
  int local_d40;
  int local_d3c;
  int local_d38;
  int local_d34;
  long *local_d30;
  int local_d28;
  int local_d24;
  int local_d20;
  int local_d1c;
  Array4<const_double> *local_d18;
  int local_d10;
  int local_d0c;
  int local_d08;
  int local_d04;
  long *local_d00;
  int local_cf8;
  int local_cf4;
  int local_cf0;
  int local_cec;
  long *local_ce8;
  int local_ce0;
  int local_cdc;
  int local_cd8;
  int local_cd4;
  Array4<const_double> *local_cd0;
  int local_cc8;
  int local_cc4;
  int local_cc0;
  int local_cbc;
  long *local_cb8;
  int local_cb0;
  int local_cac;
  int local_ca8;
  int local_ca4;
  Array4<const_double> *local_ca0;
  int local_c98;
  int local_c94;
  int local_c90;
  int local_c8c;
  long *local_c88;
  int local_c80;
  int local_c7c;
  int local_c78;
  int local_c74;
  Array4<const_double> *local_c70;
  int local_c68;
  int local_c64;
  int local_c60;
  int local_c5c;
  long *local_c58;
  int local_c50;
  int local_c4c;
  int local_c48;
  int local_c44;
  long *local_c40;
  int local_c38;
  int local_c34;
  int local_c30;
  int local_c2c;
  Array4<const_double> *local_c28;
  int local_c20;
  int local_c1c;
  int local_c18;
  int local_c14;
  long *local_c10;
  int local_c08;
  int local_c04;
  int local_c00;
  int local_bfc;
  Array4<const_double> *local_bf8;
  undefined4 local_bf0;
  int local_bec;
  int local_be8;
  int local_be4;
  Array4<const_double> *local_be0;
  undefined4 local_bd8;
  int local_bd4;
  int local_bd0;
  int local_bcc;
  Array4<const_double> *local_bc8;
  undefined4 local_bc0;
  int local_bbc;
  int local_bb8;
  int local_bb4;
  Array4<const_double> *local_bb0;
  int local_ba8;
  int local_ba4;
  int local_ba0;
  int local_b9c;
  Array4<const_double> *local_b98;
  undefined4 local_b90;
  int local_b8c;
  int local_b88;
  int local_b84;
  Array4<const_double> *local_b80;
  undefined4 local_b78;
  int local_b74;
  int local_b70;
  int local_b6c;
  Array4<const_double> *local_b68;
  undefined4 local_b60;
  int local_b5c;
  int local_b58;
  int local_b54;
  Array4<const_double> *local_b50;
  int local_b48;
  int local_b44;
  int local_b40;
  int local_b3c;
  Array4<const_double> *local_b38;
  undefined4 local_b30;
  int local_b2c;
  int local_b28;
  int local_b24;
  Array4<const_double> *local_b20;
  undefined4 local_b18;
  int local_b14;
  int local_b10;
  int local_b0c;
  Array4<const_double> *local_b08;
  undefined4 local_b00;
  int local_afc;
  int local_af8;
  int local_af4;
  Array4<const_double> *local_af0;
  int local_ae8;
  int local_ae4;
  int local_ae0;
  int local_adc;
  Array4<const_double> *local_ad8;
  undefined4 local_ad0;
  int local_acc;
  int local_ac8;
  int local_ac4;
  Array4<const_double> *local_ac0;
  undefined4 local_ab8;
  int local_ab4;
  int local_ab0;
  int local_aac;
  Array4<const_double> *local_aa8;
  undefined4 local_aa0;
  int local_a9c;
  int local_a98;
  int local_a94;
  Array4<const_double> *local_a90;
  int local_a88;
  int local_a84;
  int local_a80;
  int local_a7c;
  Array4<const_double> *local_a78;
  undefined4 local_a70;
  int local_a6c;
  int local_a68;
  int local_a64;
  Array4<const_double> *local_a60;
  undefined4 local_a58;
  int local_a54;
  int local_a50;
  int local_a4c;
  Array4<const_double> *local_a48;
  undefined4 local_a40;
  int local_a3c;
  int local_a38;
  int local_a34;
  Array4<const_double> *local_a30;
  int local_a28;
  int local_a24;
  int local_a20;
  int local_a1c;
  Array4<const_double> *local_a18;
  undefined4 local_a10;
  int local_a0c;
  int local_a08;
  int local_a04;
  Array4<const_double> *local_a00;
  undefined4 local_9f8;
  int local_9f4;
  int local_9f0;
  int local_9ec;
  Array4<const_double> *local_9e8;
  undefined4 local_9e0;
  int local_9dc;
  int local_9d8;
  int local_9d4;
  Array4<const_double> *local_9d0;
  int local_9c8;
  int local_9c4;
  int local_9c0;
  int local_9bc;
  long *local_9b8;
  int local_9b0;
  int local_9ac;
  int local_9a8;
  int local_9a4;
  long *local_9a0;
  int local_998;
  int local_994;
  int local_990;
  int local_98c;
  long *local_988;
  int local_980;
  int local_97c;
  int local_978;
  int local_974;
  long *local_970;
  int local_968;
  int local_964;
  int local_960;
  int local_95c;
  long *local_958;
  int local_950;
  int local_94c;
  int local_948;
  int local_944;
  long *local_940;
  int local_938;
  int local_934;
  int local_930;
  int local_92c;
  long *local_928;
  int local_920;
  int local_91c;
  int local_918;
  int local_914;
  long *local_910;
  int local_908;
  int local_904;
  int local_900;
  int local_8fc;
  long *local_8f8;
  int local_8f0;
  int local_8ec;
  int local_8e8;
  int local_8e4;
  long *local_8e0;
  int local_8d8;
  int local_8d4;
  int local_8d0;
  int local_8cc;
  long *local_8c8;
  int local_8c0;
  int local_8bc;
  int local_8b8;
  int local_8b4;
  long *local_8b0;
  int local_8a8;
  int local_8a4;
  int local_8a0;
  int local_89c;
  long *local_898;
  int local_890;
  int local_88c;
  int local_888;
  int local_884;
  long *local_880;
  int local_874;
  int local_870;
  int local_86c;
  long *local_868;
  int local_85c;
  int local_858;
  int local_854;
  long *local_850;
  int local_844;
  int local_840;
  int local_83c;
  long *local_838;
  int local_82c;
  int local_828;
  int local_824;
  long *local_820;
  int local_814;
  int local_810;
  int local_80c;
  long *local_808;
  int local_7fc;
  int local_7f8;
  int local_7f4;
  long *local_7f0;
  int local_7e4;
  int local_7e0;
  int local_7dc;
  long *local_7d8;
  int local_7cc;
  int local_7c8;
  int local_7c4;
  long *local_7c0;
  undefined4 local_7b4;
  IntVect *local_7b0;
  undefined4 local_7a4;
  IntVect *local_7a0;
  undefined4 local_794;
  IntVect *local_790;
  undefined4 local_784;
  IntVect *local_780;
  undefined4 local_774;
  IntVect *local_770;
  undefined4 local_764;
  IntVect *local_760;
  undefined4 local_754;
  IntVect *local_750;
  undefined4 local_744;
  IntVect *local_740;
  undefined4 local_734;
  IntVect *local_730;
  undefined4 local_724;
  IntVect *local_720;
  undefined4 local_714;
  IntVect *local_710;
  undefined4 local_704;
  IntVect *local_700;
  undefined4 local_6f4;
  IntVect *local_6f0;
  undefined4 local_6e4;
  IntVect *local_6e0;
  undefined4 local_6d4;
  IntVect *local_6d0;
  undefined4 local_6c4;
  IntVect *local_6c0;
  undefined4 local_6b4;
  IntVect *local_6b0;
  undefined4 local_6a4;
  IntVect *local_6a0;
  undefined4 local_694;
  IntVect *local_690;
  undefined4 local_684;
  IntVect *local_680;
  undefined4 local_674;
  IntVect *local_670;
  undefined4 local_664;
  IntVect *local_660;
  undefined4 local_654;
  IntVect *local_650;
  undefined4 local_644;
  IntVect *local_640;
  undefined4 local_634;
  IntVect *local_630;
  undefined4 local_624;
  IntVect *local_620;
  undefined4 local_614;
  IntVect *local_610;
  undefined4 local_604;
  IntVect *local_600;
  undefined4 local_5f4;
  IntVect *local_5f0;
  undefined4 local_5e4;
  IntVect *local_5e0;
  undefined4 local_5d4;
  IntVect *local_5d0;
  undefined4 local_5c4;
  IntVect *local_5c0;
  undefined4 local_5b4;
  IntVect *local_5b0;
  undefined4 local_5a4;
  IntVect *local_5a0;
  undefined4 local_594;
  IntVect *local_590;
  undefined4 local_584;
  IntVect *local_580;
  undefined4 local_574;
  IntVect *local_570;
  undefined4 local_564;
  IntVect *local_560;
  undefined4 local_554;
  IntVect *local_550;
  undefined4 local_544;
  IntVect *local_540;
  undefined4 local_534;
  IntVect *local_530;
  undefined4 local_524;
  IntVect *local_520;
  undefined4 local_514;
  Box *local_510;
  undefined4 local_504;
  Box *local_500;
  undefined4 local_4f4;
  Box *local_4f0;
  undefined4 local_4e4;
  Box *local_4e0;
  undefined4 local_4d4;
  Box *local_4d0;
  undefined4 local_4c4;
  Box *local_4c0;
  undefined4 local_4b4;
  Box *local_4b0;
  undefined4 local_4a4;
  Box *local_4a0;
  undefined4 local_494;
  Box *local_490;
  undefined4 local_484;
  Box *local_480;
  undefined4 local_474;
  Box *local_470;
  undefined4 local_464;
  Box *local_460;
  undefined4 local_454;
  Box *local_450;
  undefined4 local_444;
  Box *local_440;
  undefined4 local_434;
  Box *local_430;
  undefined4 local_424;
  Box *local_420;
  undefined4 local_414;
  Box *local_410;
  undefined4 local_404;
  Box *local_400;
  undefined4 local_3f4;
  Box *local_3f0;
  undefined4 local_3e4;
  Box *local_3e0;
  undefined4 local_3d4;
  Box *local_3d0;
  undefined4 local_3c4;
  Box *local_3c0;
  undefined4 local_3b4;
  Box *local_3b0;
  undefined4 local_3a4;
  Box *local_3a0;
  undefined4 local_394;
  Box *local_390;
  undefined4 local_384;
  Box *local_380;
  undefined4 local_374;
  Box *local_370;
  undefined4 local_364;
  Box *local_360;
  undefined4 local_354;
  Box *local_350;
  undefined4 local_344;
  Box *local_340;
  undefined4 local_334;
  Box *local_330;
  undefined4 local_324;
  Box *local_320;
  undefined4 local_314;
  Box *local_310;
  undefined4 local_304;
  Box *local_300;
  undefined4 local_2f4;
  Box *local_2f0;
  undefined4 local_2e4;
  Box *local_2e0;
  undefined4 local_2d4;
  Box *local_2d0;
  undefined4 local_2c4;
  Box *local_2c0;
  undefined4 local_2b4;
  Box *local_2b0;
  undefined4 local_2a4;
  Box *local_2a0;
  undefined4 local_294;
  Box *local_290;
  undefined4 local_284;
  Box *local_280;
  uint local_274;
  IntVect *local_270;
  uint local_264;
  undefined8 *local_260;
  uint local_254;
  IntVect *local_250;
  int local_248;
  uint local_244;
  IntVect *local_240;
  int local_238;
  uint local_234;
  IntVect *local_230;
  int local_228;
  uint local_224;
  IntVect *local_220;
  int local_218;
  uint local_214;
  IntVect *local_210;
  uint local_204;
  uint *local_200;
  uint local_1f8;
  uint local_1f4;
  uint *local_1f0;
  uint local_1e4;
  Dim3 local_1e0;
  Dim3 local_1cc;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  Box *local_1a0;
  double *local_198;
  Dim3 local_190;
  Box *local_180;
  int local_178;
  int iStack_174;
  int local_170;
  undefined4 local_16c;
  Box *local_168;
  undefined4 local_15c;
  Box *local_158;
  undefined4 local_14c;
  Box *local_148;
  Dim3 local_140;
  Box *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  IntVect *local_118;
  undefined4 local_10c;
  IntVect *local_108;
  undefined4 local_fc;
  IntVect *local_f8;
  Dim3 local_f0;
  Dim3 local_dc [2];
  Dim3 local_c0;
  undefined1 *local_b0;
  undefined1 *local_90;
  undefined4 local_7c;
  undefined1 *local_78;
  undefined4 local_6c;
  undefined1 *local_68;
  undefined4 local_5c;
  undefined1 *local_58;
  Dim3 local_50;
  undefined1 *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_1564 = in_ESI;
  local_1571 = MLLinOp::hasInhomogNeumannBC(in_stack_ffffffffffffe068);
  local_1572 = MLLinOp::hasRobinBC(in_stack_ffffffffffffe068);
  if (((local_1571 & 1) != 0) || ((bool)local_1572)) {
    local_1580 = Any::get<amrex::MultiFab>((Any *)in_stack_ffffffffffffe078);
    local_1584 = (**(code **)(*in_RDI + 0x28))();
    local_1588 = 0;
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
    Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
    Geometry::ProbLoArray(in_stack_ffffffffffffe070);
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
    Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
    Geometry::ProbHiArray(in_stack_ffffffffffffe070);
    local_10f8 = local_15b8;
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
    pGVar4 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                       ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                        in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
    local_15c0 = CoordSys::InvCellSize(&pGVar4->super_CoordSys,0);
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
    pGVar4 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                       ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                        in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
    local_15c8 = CoordSys::InvCellSize(&pGVar4->super_CoordSys,1);
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
    pGVar4 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                       ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                        in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
    local_15d0 = CoordSys::InvCellSize(&pGVar4->super_CoordSys,2);
    local_10ec = 0;
    local_15d8 = local_15a0[0];
    local_10e8 = local_15a0;
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
    pGVar4 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                       ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                        in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
    local_15e0 = CoordSys::CellSize(&pGVar4->super_CoordSys,0);
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
    pGVar4 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                       ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                        in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
    local_15e8 = Geometry::Domain(pGVar4);
    local_15f0 = (double)(**(code **)(*in_RDI + 0x260))();
    (**(code **)(*in_RDI + 0x270))(local_1610,in_RDI,local_1564,0);
    local_15f8 = local_1610;
    IntVect::IntVect(local_1680,0);
    IntVect::IntVect(&local_168c,1);
    Box::Box((Box *)in_stack_ffffffffffffe060,(IntVect *)in_stack_ffffffffffffe058,
             (IntVect *)0x1698f68);
    FArrayBox::FArrayBox
              ((FArrayBox *)in_stack_ffffffffffffe070,(Box *)in_stack_ffffffffffffe068,
               (int)((ulong)in_stack_ffffffffffffe060 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffe060 >> 0x18,0),
               SUB81((ulong)in_stack_ffffffffffffe060 >> 0x10,0),(Arena *)in_stack_ffffffffffffe058)
    ;
    ppMVar5 = std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                        ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe060,
                         (size_type)in_stack_ffffffffffffe058);
    local_168d = *ppMVar5 != (value_type)0x0;
    Vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                  *)in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
    local_1698 = Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                 ::operator[]((Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                               *)in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
    Vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                  *)in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
    Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                  *)in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
    local_16a0 = std::
                 unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>
                 ::operator*((unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>
                              *)in_stack_ffffffffffffe060);
    Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
                  *)in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
    local_16b8 = std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>::
                 operator*((unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_> *)
                           in_stack_ffffffffffffe060);
    MFItInfo::MFItInfo((MFItInfo *)in_stack_ffffffffffffe070);
    MFItInfo::SetDynamic(&local_16cc,true);
    MFIter::MFIter(in_stack_ffffffffffffe090,in_stack_ffffffffffffe088,in_stack_ffffffffffffe080);
    while (bVar2 = MFIter::isValid(&local_1730), bVar2) {
      MFIter::validbox((MFIter *)in_stack_ffffffffffffe070);
      local_1738 = &local_1754;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe068,
                 (MFIter *)in_stack_ffffffffffffe060);
      local_1760 = local_17a0;
      local_17a8 = MLCellLinOp::BndryCondLoc::bndryLocs
                             (in_stack_ffffffffffffe060,(MFIter *)in_stack_ffffffffffffe058);
      local_17b0 = MLCellLinOp::BndryCondLoc::bndryConds
                             (in_stack_ffffffffffffe060,(MFIter *)in_stack_ffffffffffffe058);
      for (local_17b4 = 0; (int)local_17b4 < 3; local_17b4 = local_17b4 + 1) {
        if ((local_168d & 1) == 0) {
          local_10e0 = local_1658;
          local_b0 = auStack_1640;
          local_5c = 0;
          local_6c = 1;
          local_7c = 2;
          local_8 = &iStack_1634;
          local_c = 0;
          local_38 = iStack_1634 + 1;
          local_18 = &iStack_1634;
          local_1c = 1;
          iStack_34 = local_1630 + 1;
          local_28 = &iStack_1634;
          local_2c = 2;
          local_f0.z = iStack_162c + 1;
          local_f0.y = iStack_34;
          local_f0.x = local_38;
          local_dc[0]._0_8_ = local_f0._0_8_;
          local_dc[0].z = local_f0.z;
          local_90 = local_b0;
          local_78 = local_b0;
          local_68 = local_b0;
          local_58 = local_b0;
          local_50._0_8_ = local_f0._0_8_;
          local_50.z = local_f0.z;
          local_40 = local_b0;
          local_30 = local_f0.z;
          Array4<const_double>::Array4(&local_17f8,local_1648,&local_c0,local_dc,local_1624);
        }
        else {
          std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                    ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_ffffffffffffe060,
                     (size_type)in_stack_ffffffffffffe058);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe068,
                     (MFIter *)in_stack_ffffffffffffe060);
        }
        Orientation::Orientation(&local_17fc,local_17b4,low);
        Orientation::Orientation(&local_1800,local_17b4,high);
        local_10a0 = local_1738;
        local_10a4 = local_17b4;
        local_10a8 = 1;
        pIVar6 = Box::smallEnd(local_1738);
        local_10b8.vect[2] = pIVar6->vect[2];
        local_10b8.vect._0_8_ = *(undefined8 *)pIVar6->vect;
        pIVar6 = Box::bigEnd(local_10a0);
        iVar3 = pIVar6->vect[2];
        uVar1 = *(undefined8 *)pIVar6->vect;
        local_254 = local_10a4;
        local_10cc = local_10b8.vect[(int)local_10a4];
        local_214 = local_10a4;
        local_10b8.vect[(int)local_10a4] = local_10cc - local_10a8;
        local_224 = local_10a4;
        local_10c8.vect[(int)local_10a4] = local_10cc + -1;
        local_10c8.vect._0_8_ = uVar1;
        local_10c8.vect[2] = iVar3;
        local_250 = &local_10b8;
        local_228 = local_10cc + -1;
        local_220 = &local_10c8;
        local_218 = local_10cc - local_10a8;
        local_210 = &local_10b8;
        local_10d4 = (uint)Box::ixType(local_10a0);
        local_1f0 = &local_10d0;
        local_1f4 = local_10a4;
        local_1e4 = local_10a4;
        local_10d4 = local_10d4 & ~(1 << (local_10a4 & 0x1f));
        local_10d0 = local_10d4;
        Box::Box(&local_181c,&local_10b8,&local_10c8,(IndexType)local_10d4);
        local_1040 = local_1738;
        local_1044 = local_17b4;
        local_1048 = 1;
        pIVar6 = Box::smallEnd(local_1738);
        local_1058.vect[2] = pIVar6->vect[2];
        local_1058.vect._0_8_ = *(undefined8 *)pIVar6->vect;
        pIVar6 = Box::bigEnd(local_1040);
        local_1068.vect[2] = pIVar6->vect[2];
        local_1068.vect._0_8_ = *(undefined8 *)pIVar6->vect;
        IVar11 = Box::type(in_stack_ffffffffffffe078);
        local_1088._0_8_ = IVar11.vect._0_8_;
        local_1078._0_4_ = local_1088[0];
        local_1078._4_4_ = local_1088[1];
        local_1088[2] = IVar11.vect[2];
        local_1070 = local_1088[2];
        local_264 = local_1044;
        local_106c = *(uint *)((long)&local_1078 + (long)(int)local_1044 * 4);
        local_274 = local_1044;
        local_108c = (local_1068.vect[(int)local_1044] + 1) - (local_106c & 1);
        local_234 = local_1044;
        local_1058.vect[(int)local_1044] = local_108c;
        iVar3 = local_108c + local_1048 + -1;
        local_244 = local_1044;
        local_1068.vect[(int)local_1044] = iVar3;
        local_1088 = IVar11.vect;
        local_270 = &local_1068;
        local_260 = &local_1078;
        local_248 = iVar3;
        local_240 = &local_1068;
        local_238 = local_108c;
        local_230 = &local_1058;
        local_1094 = (uint)Box::ixType(local_1040);
        local_200 = &local_1090;
        local_204 = local_1044;
        local_1f8 = local_1044;
        local_1094 = (1 << ((byte)local_1044 & 0x1f) ^ 0xffffffffU) & local_1094;
        local_1090 = local_1094;
        Box::Box(&local_1838,&local_1058,&local_1068,(IndexType)local_1094);
        Orientation::operator_cast_to_int(&local_17fc);
        std::array<amrex::MultiMask,_6UL>::operator[]
                  ((array<amrex::MultiMask,_6UL> *)in_stack_ffffffffffffe060,
                   (size_type)in_stack_ffffffffffffe058);
        MultiMask::array((MultiMask *)in_stack_ffffffffffffe060,(MFIter *)in_stack_ffffffffffffe058)
        ;
        local_1840 = local_1880;
        Orientation::operator_cast_to_int(&local_1800);
        std::array<amrex::MultiMask,_6UL>::operator[]
                  ((array<amrex::MultiMask,_6UL> *)in_stack_ffffffffffffe060,
                   (size_type)in_stack_ffffffffffffe058);
        MultiMask::array((MultiMask *)in_stack_ffffffffffffe060,(MFIter *)in_stack_ffffffffffffe058)
        ;
        local_1888 = local_18c8;
        local_1914 = local_17fc.val;
        BndryData::bndryValues
                  (in_stack_ffffffffffffe058,
                   (Orientation)(int)((ulong)in_stack_ffffffffffffe060 >> 0x20));
        FabSet::array((FabSet *)in_stack_ffffffffffffe060,(MFIter *)in_stack_ffffffffffffe058);
        local_18d0 = local_1910;
        local_1964 = local_1800.val;
        BndryData::bndryValues
                  (in_stack_ffffffffffffe058,
                   (Orientation)(int)((ulong)in_stack_ffffffffffffe060 >> 0x20));
        FabSet::array((FabSet *)in_stack_ffffffffffffe060,(MFIter *)in_stack_ffffffffffffe058);
        local_1920 = local_1960;
        bVar2 = Box::contains(local_15e8,&local_181c);
        local_1965 = (bVar2 ^ 0xffU) & 1;
        bVar2 = Box::contains(local_15e8,&local_1838);
        local_1966 = (bVar2 ^ 0xffU) & 1;
        if (((local_1965 & 1) != 0) || (local_1966 != 0)) {
          for (local_196c = 0; local_196c < local_1584; local_196c = local_196c + 1) {
            Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
            ::operator[]((Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
                          *)in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
            Orientation::operator_cast_to_int(&local_17fc);
            pvVar7 = std::array<amrex::BoundCond,_6UL>::operator[]
                               ((array<amrex::BoundCond,_6UL> *)in_stack_ffffffffffffe060,
                                (size_type)in_stack_ffffffffffffe058);
            local_1970 = pvVar7->bctype;
            Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
            ::operator[]((Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
                          *)in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
            Orientation::operator_cast_to_int(&local_1800);
            pvVar7 = std::array<amrex::BoundCond,_6UL>::operator[]
                               ((array<amrex::BoundCond,_6UL> *)in_stack_ffffffffffffe060,
                                (size_type)in_stack_ffffffffffffe058);
            local_1974 = pvVar7->bctype;
            Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>::operator[]
                      ((Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_> *
                       )in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
            Orientation::operator_cast_to_int(&local_17fc);
            pvVar8 = std::array<double,_6UL>::operator[]
                               ((array<double,_6UL> *)in_stack_ffffffffffffe060,
                                (size_type)in_stack_ffffffffffffe058);
            local_1980 = *pvVar8;
            Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>::operator[]
                      ((Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_> *
                       )in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
            Orientation::operator_cast_to_int(&local_1800);
            pvVar8 = std::array<double,_6UL>::operator[]
                               ((array<double,_6UL> *)in_stack_ffffffffffffe060,
                                (size_type)in_stack_ffffffffffffe058);
            local_1988 = *pvVar8;
            Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                          *)in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
            pvVar9 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                               ((array<amrex::LinOpBCType,_3UL> *)in_stack_ffffffffffffe060,
                                (size_type)in_stack_ffffffffffffe058);
            if ((*pvVar9 == inhomogNeumann) && ((local_1965 & 1) != 0)) {
              if (local_17b4 == 0) {
                local_1990 = local_15f0 * local_15c0;
                local_1340 = &local_181c;
                local_4f4 = 0;
                local_504 = 1;
                local_19a0 = local_181c.smallend.vect[0];
                iStack_199c = local_181c.smallend.vect[1];
                local_514 = 2;
                local_790 = &local_181c.bigend;
                local_794 = 0;
                local_7a0 = &local_181c.bigend;
                local_7a4 = 1;
                local_19bc = CONCAT44(local_181c.bigend.vect[1],local_181c.bigend.vect[0]);
                local_7b0 = &local_181c.bigend;
                local_7b4 = 2;
                local_19b4 = local_181c.bigend.vect[2];
                local_1110 = local_1340;
                local_510 = local_1340;
                local_500 = local_1340;
                local_4f0 = local_1340;
                for (local_19d4 = local_181c.smallend.vect[2]; local_19d4 <= local_19b4;
                    local_19d4 = local_19d4 + 1) {
                  for (local_19d8 = iStack_199c; local_19d8 <= local_19bc._4_4_;
                      local_19d8 = local_19d8 + 1) {
                    for (local_19dc = local_19a0; local_19dc <= (int)local_19bc;
                        local_19dc = local_19dc + 1) {
                      local_19e0 = local_1970;
                      local_fec.bctype = local_1970;
                      local_ff0 = local_19dc;
                      local_ff4 = local_19d8;
                      local_ff8 = local_19d4;
                      local_1000 = local_1760;
                      local_1008 = local_1840;
                      local_1010 = &local_17f8;
                      local_1018 = local_1980;
                      local_1020 = local_18d0;
                      local_1028 = local_1990;
                      local_1029 = local_168d & 1;
                      local_1030 = local_196c;
                      iVar3 = BoundCond::operator_cast_to_int(&local_fec);
                      if (iVar3 == 0x66) {
                        local_7c0 = local_1008;
                        local_7c4 = local_ff0;
                        local_7c8 = local_ff4;
                        local_7cc = local_ff8;
                        if (*(int *)(*local_1008 +
                                    ((long)(local_ff0 - (int)local_1008[4]) +
                                     (long)(local_ff4 - *(int *)((long)local_1008 + 0x24)) *
                                     local_1008[1] +
                                    (long)(local_ff8 - (int)local_1008[5]) * local_1008[2]) * 4) ==
                            2) {
                          if ((local_1029 & 1) == 0) {
                            local_1038 = 1.0;
                          }
                          else {
                            local_c2c = local_ff0 + 1;
                            local_c28 = local_1010;
                            local_c30 = local_ff4;
                            local_c34 = local_ff8;
                            local_c38 = local_1030;
                            local_1038 = local_1010->p
                                         [(long)(local_c2c - (local_1010->begin).x) +
                                          (long)(local_ff4 - (local_1010->begin).y) *
                                          local_1010->jstride +
                                          (long)(local_ff8 - (local_1010->begin).z) *
                                          local_1010->kstride +
                                          (long)local_1030 * local_1010->nstride];
                          }
                          local_c10 = local_1020;
                          local_c14 = local_ff0;
                          local_c18 = local_ff4;
                          local_c1c = local_ff8;
                          local_c20 = local_1030;
                          local_914 = local_ff0 + 1;
                          local_910 = local_1000;
                          local_918 = local_ff4;
                          local_91c = local_ff8;
                          local_920 = local_1030;
                          lVar10 = (long)(local_914 - (int)local_1000[4]) +
                                   (long)(local_ff4 - *(int *)((long)local_1000 + 0x24)) *
                                   local_1000[1] +
                                   (long)(local_ff8 - (int)local_1000[5]) * local_1000[2] +
                                   (long)local_1030 * local_1000[3];
                          *(double *)(*local_1000 + lVar10 * 8) =
                               -(local_1028 * local_1038) *
                               *(double *)
                                (*local_1020 +
                                ((long)(local_ff0 - (int)local_1020[4]) +
                                 (long)(local_ff4 - *(int *)((long)local_1020 + 0x24)) *
                                 local_1020[1] +
                                 (long)(local_ff8 - (int)local_1020[5]) * local_1020[2] +
                                (long)local_1030 * local_1020[3]) * 8) +
                               *(double *)(*local_1000 + lVar10 * 8);
                        }
                      }
                    }
                  }
                }
              }
              else if (local_17b4 == 1) {
                local_19e8 = local_15f0 * local_15c8;
                if (((*(byte *)(in_RDI + 0x3b) & 1) == 0) || ((local_168d & 1) != 0)) {
                  local_1390 = &local_181c;
                  local_494 = 0;
                  local_4a4 = 1;
                  local_1a48 = local_181c.smallend.vect[0];
                  iStack_1a44 = local_181c.smallend.vect[1];
                  local_4b4 = 2;
                  local_730 = &local_181c.bigend;
                  local_734 = 0;
                  local_740 = &local_181c.bigend;
                  local_744 = 1;
                  local_1a64 = CONCAT44(local_181c.bigend.vect[1],local_181c.bigend.vect[0]);
                  local_750 = &local_181c.bigend;
                  local_754 = 2;
                  local_1a5c = local_181c.bigend.vect[2];
                  local_1160 = local_1390;
                  local_4b0 = local_1390;
                  local_4a0 = local_1390;
                  local_490 = local_1390;
                  for (local_1a7c = local_181c.smallend.vect[2]; local_1a7c <= local_1a5c;
                      local_1a7c = local_1a7c + 1) {
                    for (local_1a80 = iStack_1a44; local_1a80 <= local_1a64._4_4_;
                        local_1a80 = local_1a80 + 1) {
                      for (local_1a84 = local_1a48; local_1a84 <= (int)local_1a64;
                          local_1a84 = local_1a84 + 1) {
                        local_1a88 = local_1970;
                        local_f44.bctype = local_1970;
                        local_f48 = local_1a84;
                        local_f4c = local_1a80;
                        local_f50 = local_1a7c;
                        local_f58 = local_1760;
                        local_f60 = local_1840;
                        local_f68 = &local_17f8;
                        local_f70 = local_1980;
                        local_f78 = local_18d0;
                        local_f80 = local_19e8;
                        local_f81 = local_168d & 1;
                        local_f88 = local_196c;
                        iVar3 = BoundCond::operator_cast_to_int(&local_f44);
                        if (iVar3 == 0x66) {
                          local_7f0 = local_f60;
                          local_7f4 = local_f48;
                          local_7f8 = local_f4c;
                          local_7fc = local_f50;
                          if (*(int *)(*local_f60 +
                                      ((long)(local_f48 - (int)local_f60[4]) +
                                       (long)(local_f4c - *(int *)((long)local_f60 + 0x24)) *
                                       local_f60[1] +
                                      (long)(local_f50 - (int)local_f60[5]) * local_f60[2]) * 4) ==
                              2) {
                            if ((local_f81 & 1) == 0) {
                              local_f90 = 1.0;
                            }
                            else {
                              local_c78 = local_f4c + 1;
                              local_c70 = local_f68;
                              local_c74 = local_f48;
                              local_c7c = local_f50;
                              local_c80 = local_f88;
                              local_f90 = local_f68->p
                                          [(long)(local_f48 - (local_f68->begin).x) +
                                           (long)(local_c78 - (local_f68->begin).y) *
                                           local_f68->jstride +
                                           (long)(local_f50 - (local_f68->begin).z) *
                                           local_f68->kstride + (long)local_f88 * local_f68->nstride
                                          ];
                            }
                            local_c58 = local_f78;
                            local_c5c = local_f48;
                            local_c60 = local_f4c;
                            local_c64 = local_f50;
                            local_c68 = local_f88;
                            local_948 = local_f4c + 1;
                            local_940 = local_f58;
                            local_944 = local_f48;
                            local_94c = local_f50;
                            local_950 = local_f88;
                            lVar10 = (long)(local_f48 - (int)local_f58[4]) +
                                     (long)(local_948 - *(int *)((long)local_f58 + 0x24)) *
                                     local_f58[1] +
                                     (long)(local_f50 - (int)local_f58[5]) * local_f58[2] +
                                     (long)local_f88 * local_f58[3];
                            *(double *)(*local_f58 + lVar10 * 8) =
                                 -(local_f80 * local_f90) *
                                 *(double *)
                                  (*local_f78 +
                                  ((long)(local_f48 - (int)local_f78[4]) +
                                   (long)(local_f4c - *(int *)((long)local_f78 + 0x24)) *
                                   local_f78[1] +
                                   (long)(local_f50 - (int)local_f78[5]) * local_f78[2] +
                                  (long)local_f88 * local_f78[3]) * 8) +
                                 *(double *)(*local_f58 + lVar10 * 8);
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  local_1368 = &local_181c;
                  local_4c4 = 0;
                  local_4d4 = 1;
                  local_19f8 = local_181c.smallend.vect[0];
                  iStack_19f4 = local_181c.smallend.vect[1];
                  local_4e4 = 2;
                  local_760 = &local_181c.bigend;
                  local_764 = 0;
                  local_770 = &local_181c.bigend;
                  local_774 = 1;
                  local_1a14 = CONCAT44(local_181c.bigend.vect[1],local_181c.bigend.vect[0]);
                  local_780 = &local_181c.bigend;
                  local_784 = 2;
                  local_1a0c = local_181c.bigend.vect[2];
                  local_1138 = local_1368;
                  local_4e0 = local_1368;
                  local_4d0 = local_1368;
                  local_4c0 = local_1368;
                  for (local_1a2c = local_181c.smallend.vect[2]; local_1a2c <= local_1a0c;
                      local_1a2c = local_1a2c + 1) {
                    for (local_1a30 = iStack_19f4; local_1a30 <= local_1a14._4_4_;
                        local_1a30 = local_1a30 + 1) {
                      for (local_1a34 = local_19f8; local_1a34 <= (int)local_1a14;
                          local_1a34 = local_1a34 + 1) {
                        local_1a38 = local_1970;
                        local_f94.bctype = local_1970;
                        local_f98 = local_1a34;
                        local_f9c = local_1a30;
                        local_fa0 = local_1a2c;
                        local_fa8 = local_1760;
                        local_fb0 = local_1840;
                        local_fb8 = local_1980;
                        local_fc0 = local_18d0;
                        local_fc8 = local_19e8;
                        local_fd0 = local_15d8;
                        local_fd8 = local_15e0;
                        local_fdc = local_196c;
                        iVar3 = BoundCond::operator_cast_to_int(&local_f94);
                        if (iVar3 == 0x66) {
                          local_7d8 = local_fb0;
                          local_7dc = local_f98;
                          local_7e0 = local_f9c;
                          local_7e4 = local_fa0;
                          if (*(int *)(*local_fb0 +
                                      ((long)(local_f98 - (int)local_fb0[4]) +
                                       (long)(local_f9c - *(int *)((long)local_fb0 + 0x24)) *
                                       local_fb0[1] +
                                      (long)(local_fa0 - (int)local_fb0[5]) * local_fb0[2]) * 4) ==
                              2) {
                            local_fe8 = ((double)local_f98 + 0.5) * local_fd8 + local_fd0;
                            local_c40 = local_fc0;
                            local_c44 = local_f98;
                            local_c48 = local_f9c;
                            local_c4c = local_fa0;
                            local_c50 = local_fdc;
                            local_930 = local_f9c + 1;
                            local_928 = local_fa8;
                            local_92c = local_f98;
                            local_934 = local_fa0;
                            local_938 = local_fdc;
                            lVar10 = (long)(local_f98 - (int)local_fa8[4]) +
                                     (long)(local_930 - *(int *)((long)local_fa8 + 0x24)) *
                                     local_fa8[1] +
                                     (long)(local_fa0 - (int)local_fa8[5]) * local_fa8[2] +
                                     (long)local_fdc * local_fa8[3];
                            *(double *)(*local_fa8 + lVar10 * 8) =
                                 -(local_fc8 * local_fe8) *
                                 *(double *)
                                  (*local_fc0 +
                                  ((long)(local_f98 - (int)local_fc0[4]) +
                                   (long)(local_f9c - *(int *)((long)local_fc0 + 0x24)) *
                                   local_fc0[1] +
                                   (long)(local_fa0 - (int)local_fc0[5]) * local_fc0[2] +
                                  (long)local_fdc * local_fc0[3]) * 8) +
                                 *(double *)(*local_fa8 + lVar10 * 8);
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
                local_1a90 = local_15f0 * local_15d0;
                local_13b8 = &local_181c;
                local_464 = 0;
                local_474 = 1;
                local_1aa0 = local_181c.smallend.vect[0];
                iStack_1a9c = local_181c.smallend.vect[1];
                local_484 = 2;
                local_700 = &local_181c.bigend;
                local_704 = 0;
                local_710 = &local_181c.bigend;
                local_714 = 1;
                local_1abc = CONCAT44(local_181c.bigend.vect[1],local_181c.bigend.vect[0]);
                local_720 = &local_181c.bigend;
                local_724 = 2;
                local_1ab4 = local_181c.bigend.vect[2];
                local_1188 = local_13b8;
                local_480 = local_13b8;
                local_470 = local_13b8;
                local_460 = local_13b8;
                for (local_1ad4 = local_181c.smallend.vect[2]; local_1ad4 <= local_1ab4;
                    local_1ad4 = local_1ad4 + 1) {
                  for (local_1ad8 = iStack_1a9c; local_1ad8 <= local_1abc._4_4_;
                      local_1ad8 = local_1ad8 + 1) {
                    for (local_1adc = local_1aa0; local_1adc <= (int)local_1abc;
                        local_1adc = local_1adc + 1) {
                      local_1ae0 = local_1970;
                      local_ef4.bctype = local_1970;
                      local_ef8 = local_1adc;
                      local_efc = local_1ad8;
                      local_f00 = local_1ad4;
                      local_f08 = local_1760;
                      local_f10 = local_1840;
                      local_f18 = &local_17f8;
                      local_f20 = local_1980;
                      local_f28 = local_18d0;
                      local_f30 = local_1a90;
                      local_f31 = local_168d & 1;
                      local_f38 = local_196c;
                      iVar3 = BoundCond::operator_cast_to_int(&local_ef4);
                      if (iVar3 == 0x66) {
                        local_808 = local_f10;
                        local_80c = local_ef8;
                        local_810 = local_efc;
                        local_814 = local_f00;
                        if (*(int *)(*local_f10 +
                                    ((long)(local_ef8 - (int)local_f10[4]) +
                                     (long)(local_efc - *(int *)((long)local_f10 + 0x24)) *
                                     local_f10[1] +
                                    (long)(local_f00 - (int)local_f10[5]) * local_f10[2]) * 4) == 2)
                        {
                          if ((local_f31 & 1) == 0) {
                            local_f40 = 1.0;
                          }
                          else {
                            local_cac = local_f00 + 1;
                            local_ca0 = local_f18;
                            local_ca4 = local_ef8;
                            local_ca8 = local_efc;
                            local_cb0 = local_f38;
                            local_f40 = local_f18->p
                                        [(long)(local_ef8 - (local_f18->begin).x) +
                                         (long)(local_efc - (local_f18->begin).y) *
                                         local_f18->jstride +
                                         (long)(local_cac - (local_f18->begin).z) *
                                         local_f18->kstride + (long)local_f38 * local_f18->nstride];
                          }
                          local_c88 = local_f28;
                          local_c8c = local_ef8;
                          local_c90 = local_efc;
                          local_c94 = local_f00;
                          local_c98 = local_f38;
                          local_964 = local_f00 + 1;
                          local_958 = local_f08;
                          local_95c = local_ef8;
                          local_960 = local_efc;
                          local_968 = local_f38;
                          lVar10 = (long)(local_ef8 - (int)local_f08[4]) +
                                   (long)(local_efc - *(int *)((long)local_f08 + 0x24)) *
                                   local_f08[1] +
                                   (long)(local_964 - (int)local_f08[5]) * local_f08[2] +
                                   (long)local_f38 * local_f08[3];
                          *(double *)(*local_f08 + lVar10 * 8) =
                               -(local_f30 * local_f40) *
                               *(double *)
                                (*local_f28 +
                                ((long)(local_ef8 - (int)local_f28[4]) +
                                 (long)(local_efc - *(int *)((long)local_f28 + 0x24)) * local_f28[1]
                                 + (long)(local_f00 - (int)local_f28[5]) * local_f28[2] +
                                (long)local_f38 * local_f28[3]) * 8) +
                               *(double *)(*local_f08 + lVar10 * 8);
                        }
                      }
                    }
                  }
                }
              }
            }
            Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                          *)in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
            pvVar9 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                               ((array<amrex::LinOpBCType,_3UL> *)in_stack_ffffffffffffe060,
                                (size_type)in_stack_ffffffffffffe058);
            if ((*pvVar9 == inhomogNeumann) && ((local_1966 & 1) != 0)) {
              if (local_17b4 == 0) {
                local_1ae8 = local_15f0 * local_15c0;
                local_13e0 = &local_1838;
                local_434 = 0;
                local_444 = 1;
                local_1af8 = local_1838.smallend.vect[0];
                iStack_1af4 = local_1838.smallend.vect[1];
                local_454 = 2;
                local_6d0 = &local_1838.bigend;
                local_6d4 = 0;
                local_6e0 = &local_1838.bigend;
                local_6e4 = 1;
                local_1b14 = CONCAT44(local_1838.bigend.vect[1],local_1838.bigend.vect[0]);
                local_6f0 = &local_1838.bigend;
                local_6f4 = 2;
                local_1b0c = local_1838.bigend.vect[2];
                local_11b0 = local_13e0;
                local_450 = local_13e0;
                local_440 = local_13e0;
                local_430 = local_13e0;
                for (local_1b2c = local_1838.smallend.vect[2]; local_1b2c <= local_1b0c;
                    local_1b2c = local_1b2c + 1) {
                  for (local_1b30 = iStack_1af4; local_1b30 <= local_1b14._4_4_;
                      local_1b30 = local_1b30 + 1) {
                    for (local_1b34 = local_1af8; local_1b34 <= (int)local_1b14;
                        local_1b34 = local_1b34 + 1) {
                      local_1b38 = local_1974;
                      local_ea4.bctype = local_1974;
                      local_ea8 = local_1b34;
                      local_eac = local_1b30;
                      local_eb0 = local_1b2c;
                      local_eb8 = local_1760;
                      local_ec0 = local_1888;
                      local_ec8 = &local_17f8;
                      local_ed0 = local_1988;
                      local_ed8 = local_1920;
                      local_ee0 = local_1ae8;
                      local_ee1 = local_168d & 1;
                      local_ee8 = local_196c;
                      iVar3 = BoundCond::operator_cast_to_int(&local_ea4);
                      if (iVar3 == 0x66) {
                        local_820 = local_ec0;
                        local_824 = local_ea8;
                        local_828 = local_eac;
                        local_82c = local_eb0;
                        if (*(int *)(*local_ec0 +
                                    ((long)(local_ea8 - (int)local_ec0[4]) +
                                     (long)(local_eac - *(int *)((long)local_ec0 + 0x24)) *
                                     local_ec0[1] +
                                    (long)(local_eb0 - (int)local_ec0[5]) * local_ec0[2]) * 4) == 2)
                        {
                          if ((local_ee1 & 1) == 0) {
                            in_stack_ffffffffffffe078 = (Box *)&DAT_3ff0000000000000;
                          }
                          else {
                            local_cd0 = local_ec8;
                            local_cd4 = local_ea8;
                            local_cd8 = local_eac;
                            local_cdc = local_eb0;
                            local_ce0 = local_ee8;
                            in_stack_ffffffffffffe078 =
                                 (Box *)local_ec8->p
                                        [(long)(local_ea8 - (local_ec8->begin).x) +
                                         (long)(local_eac - (local_ec8->begin).y) *
                                         local_ec8->jstride +
                                         (long)(local_eb0 - (local_ec8->begin).z) *
                                         local_ec8->kstride + (long)local_ee8 * local_ec8->nstride];
                          }
                          local_cb8 = local_ed8;
                          local_cbc = local_ea8;
                          local_cc0 = local_eac;
                          local_cc4 = local_eb0;
                          local_cc8 = local_ee8;
                          local_974 = local_ea8 + -1;
                          local_970 = local_eb8;
                          local_978 = local_eac;
                          local_97c = local_eb0;
                          local_980 = local_ee8;
                          lVar10 = (long)(local_974 - (int)local_eb8[4]) +
                                   (long)(local_eac - *(int *)((long)local_eb8 + 0x24)) *
                                   local_eb8[1] +
                                   (long)(local_eb0 - (int)local_eb8[5]) * local_eb8[2] +
                                   (long)local_ee8 * local_eb8[3];
                          *(double *)(*local_eb8 + lVar10 * 8) =
                               local_ee0 * (double)in_stack_ffffffffffffe078 *
                               *(double *)
                                (*local_ed8 +
                                ((long)(local_ea8 - (int)local_ed8[4]) +
                                 (long)(local_eac - *(int *)((long)local_ed8 + 0x24)) * local_ed8[1]
                                 + (long)(local_eb0 - (int)local_ed8[5]) * local_ed8[2] +
                                (long)local_ee8 * local_ed8[3]) * 8) +
                               *(double *)(*local_eb8 + lVar10 * 8);
                          local_ef0 = in_stack_ffffffffffffe078;
                        }
                      }
                    }
                  }
                }
              }
              else if (local_17b4 == 1) {
                local_1b40 = local_15f0 * local_15c8;
                if (((*(byte *)(in_RDI + 0x3b) & 1) == 0) || ((local_168d & 1) != 0)) {
                  local_1430 = &local_1838;
                  local_3d4 = 0;
                  local_3e4 = 1;
                  local_1ba0 = local_1838.smallend.vect[0];
                  iStack_1b9c = local_1838.smallend.vect[1];
                  local_3f4 = 2;
                  local_670 = &local_1838.bigend;
                  local_674 = 0;
                  local_680 = &local_1838.bigend;
                  local_684 = 1;
                  local_1bbc = CONCAT44(local_1838.bigend.vect[1],local_1838.bigend.vect[0]);
                  local_690 = &local_1838.bigend;
                  local_694 = 2;
                  local_1bb4 = local_1838.bigend.vect[2];
                  local_1200 = local_1430;
                  local_3f0 = local_1430;
                  local_3e0 = local_1430;
                  local_3d0 = local_1430;
                  for (local_1bd4 = local_1838.smallend.vect[2]; local_1bd4 <= local_1bb4;
                      local_1bd4 = local_1bd4 + 1) {
                    for (local_1bd8 = iStack_1b9c; local_1bd8 <= local_1bbc._4_4_;
                        local_1bd8 = local_1bd8 + 1) {
                      for (local_1bdc = local_1ba0; local_1bdc <= (int)local_1bbc;
                          local_1bdc = local_1bdc + 1) {
                        local_1be0 = local_1974;
                        local_dfc.bctype = local_1974;
                        local_e00 = local_1bdc;
                        local_e04 = local_1bd8;
                        local_e08 = local_1bd4;
                        local_e10 = local_1760;
                        local_e18 = local_1888;
                        local_e20 = &local_17f8;
                        local_e28 = local_1988;
                        local_e30 = local_1920;
                        local_e38 = local_1b40;
                        local_e39 = local_168d & 1;
                        local_e40 = local_196c;
                        iVar3 = BoundCond::operator_cast_to_int(&local_dfc);
                        if (iVar3 == 0x66) {
                          local_850 = local_e18;
                          local_854 = local_e00;
                          local_858 = local_e04;
                          local_85c = local_e08;
                          if (*(int *)(*local_e18 +
                                      ((long)(local_e00 - (int)local_e18[4]) +
                                       (long)(local_e04 - *(int *)((long)local_e18 + 0x24)) *
                                       local_e18[1] +
                                      (long)(local_e08 - (int)local_e18[5]) * local_e18[2]) * 4) ==
                              2) {
                            if ((local_e39 & 1) == 0) {
                              in_stack_ffffffffffffe070 = (Geometry *)&DAT_3ff0000000000000;
                            }
                            else {
                              local_d18 = local_e20;
                              local_d1c = local_e00;
                              local_d20 = local_e04;
                              local_d24 = local_e08;
                              local_d28 = local_e40;
                              in_stack_ffffffffffffe070 =
                                   (Geometry *)
                                   local_e20->p
                                   [(long)(local_e00 - (local_e20->begin).x) +
                                    (long)(local_e04 - (local_e20->begin).y) * local_e20->jstride +
                                    (long)(local_e08 - (local_e20->begin).z) * local_e20->kstride +
                                    (long)local_e40 * local_e20->nstride];
                            }
                            local_d00 = local_e30;
                            local_d04 = local_e00;
                            local_d08 = local_e04;
                            local_d0c = local_e08;
                            local_d10 = local_e40;
                            local_9a8 = local_e04 + -1;
                            local_9a0 = local_e10;
                            local_9a4 = local_e00;
                            local_9ac = local_e08;
                            local_9b0 = local_e40;
                            lVar10 = (long)(local_e00 - (int)local_e10[4]) +
                                     (long)(local_9a8 - *(int *)((long)local_e10 + 0x24)) *
                                     local_e10[1] +
                                     (long)(local_e08 - (int)local_e10[5]) * local_e10[2] +
                                     (long)local_e40 * local_e10[3];
                            *(double *)(*local_e10 + lVar10 * 8) =
                                 local_e38 * (double)in_stack_ffffffffffffe070 *
                                 *(double *)
                                  (*local_e30 +
                                  ((long)(local_e00 - (int)local_e30[4]) +
                                   (long)(local_e04 - *(int *)((long)local_e30 + 0x24)) *
                                   local_e30[1] +
                                   (long)(local_e08 - (int)local_e30[5]) * local_e30[2] +
                                  (long)local_e40 * local_e30[3]) * 8) +
                                 *(double *)(*local_e10 + lVar10 * 8);
                            local_e48 = in_stack_ffffffffffffe070;
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  local_1408 = &local_1838;
                  local_404 = 0;
                  local_414 = 1;
                  local_1b50 = local_1838.smallend.vect[0];
                  iStack_1b4c = local_1838.smallend.vect[1];
                  local_424 = 2;
                  local_6a0 = &local_1838.bigend;
                  local_6a4 = 0;
                  local_6b0 = &local_1838.bigend;
                  local_6b4 = 1;
                  local_1b6c = CONCAT44(local_1838.bigend.vect[1],local_1838.bigend.vect[0]);
                  local_6c0 = &local_1838.bigend;
                  local_6c4 = 2;
                  local_1b64 = local_1838.bigend.vect[2];
                  local_11d8 = local_1408;
                  local_420 = local_1408;
                  local_410 = local_1408;
                  local_400 = local_1408;
                  for (local_1b84 = local_1838.smallend.vect[2]; local_1b84 <= local_1b64;
                      local_1b84 = local_1b84 + 1) {
                    for (local_1b88 = iStack_1b4c; local_1b88 <= local_1b6c._4_4_;
                        local_1b88 = local_1b88 + 1) {
                      for (local_1b8c = local_1b50; local_1b8c <= (int)local_1b6c;
                          local_1b8c = local_1b8c + 1) {
                        local_1b90 = local_1974;
                        local_e4c.bctype = local_1974;
                        local_e50 = local_1b8c;
                        local_e54 = local_1b88;
                        local_e58 = local_1b84;
                        local_e60 = local_1760;
                        local_e68 = local_1888;
                        local_e70 = local_1988;
                        local_e78 = local_1920;
                        local_e80 = local_1b40;
                        local_e88 = local_15d8;
                        local_e90 = local_15e0;
                        local_e94 = local_196c;
                        iVar3 = BoundCond::operator_cast_to_int(&local_e4c);
                        if (iVar3 == 0x66) {
                          local_838 = local_e68;
                          local_83c = local_e50;
                          local_840 = local_e54;
                          local_844 = local_e58;
                          if (*(int *)(*local_e68 +
                                      ((long)(local_e50 - (int)local_e68[4]) +
                                       (long)(local_e54 - *(int *)((long)local_e68 + 0x24)) *
                                       local_e68[1] +
                                      (long)(local_e58 - (int)local_e68[5]) * local_e68[2]) * 4) ==
                              2) {
                            local_ea0 = ((double)local_e50 + 0.5) * local_e90 + local_e88;
                            local_ce8 = local_e78;
                            local_cec = local_e50;
                            local_cf0 = local_e54;
                            local_cf4 = local_e58;
                            local_cf8 = local_e94;
                            local_990 = local_e54 + -1;
                            local_988 = local_e60;
                            local_98c = local_e50;
                            local_994 = local_e58;
                            local_998 = local_e94;
                            lVar10 = (long)(local_e50 - (int)local_e60[4]) +
                                     (long)(local_990 - *(int *)((long)local_e60 + 0x24)) *
                                     local_e60[1] +
                                     (long)(local_e58 - (int)local_e60[5]) * local_e60[2] +
                                     (long)local_e94 * local_e60[3];
                            *(double *)(*local_e60 + lVar10 * 8) =
                                 local_e80 * local_ea0 *
                                 *(double *)
                                  (*local_e78 +
                                  ((long)(local_e50 - (int)local_e78[4]) +
                                   (long)(local_e54 - *(int *)((long)local_e78 + 0x24)) *
                                   local_e78[1] +
                                   (long)(local_e58 - (int)local_e78[5]) * local_e78[2] +
                                  (long)local_e94 * local_e78[3]) * 8) +
                                 *(double *)(*local_e60 + lVar10 * 8);
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
                local_1be8 = local_15f0 * local_15d0;
                local_1458 = &local_1838;
                local_3a4 = 0;
                local_3b4 = 1;
                local_1bf8 = local_1838.smallend.vect[0];
                iStack_1bf4 = local_1838.smallend.vect[1];
                local_3c4 = 2;
                local_640 = &local_1838.bigend;
                local_644 = 0;
                local_650 = &local_1838.bigend;
                local_654 = 1;
                local_1c14 = CONCAT44(local_1838.bigend.vect[1],local_1838.bigend.vect[0]);
                local_660 = &local_1838.bigend;
                local_664 = 2;
                local_1c0c = local_1838.bigend.vect[2];
                local_1228 = local_1458;
                local_3c0 = local_1458;
                local_3b0 = local_1458;
                local_3a0 = local_1458;
                for (local_1c2c = local_1838.smallend.vect[2]; local_1c2c <= local_1c0c;
                    local_1c2c = local_1c2c + 1) {
                  for (local_1c30 = iStack_1bf4; local_1c30 <= local_1c14._4_4_;
                      local_1c30 = local_1c30 + 1) {
                    for (local_1c34 = local_1bf8; local_1c34 <= (int)local_1c14;
                        local_1c34 = local_1c34 + 1) {
                      local_1c38 = local_1974;
                      local_dac.bctype = local_1974;
                      local_db0 = local_1c34;
                      local_db4 = local_1c30;
                      local_db8 = local_1c2c;
                      local_dc0 = local_1760;
                      local_dc8 = local_1888;
                      local_dd0 = &local_17f8;
                      local_dd8 = local_1988;
                      local_de0 = local_1920;
                      local_de8 = local_1be8;
                      local_de9 = local_168d & 1;
                      local_df0 = local_196c;
                      iVar3 = BoundCond::operator_cast_to_int(&local_dac);
                      if (iVar3 == 0x66) {
                        local_868 = local_dc8;
                        local_86c = local_db0;
                        local_870 = local_db4;
                        local_874 = local_db8;
                        if (*(int *)(*local_dc8 +
                                    ((long)(local_db0 - (int)local_dc8[4]) +
                                     (long)(local_db4 - *(int *)((long)local_dc8 + 0x24)) *
                                     local_dc8[1] +
                                    (long)(local_db8 - (int)local_dc8[5]) * local_dc8[2]) * 4) == 2)
                        {
                          if ((local_de9 & 1) == 0) {
                            in_stack_ffffffffffffe068 = (MLLinOp *)&DAT_3ff0000000000000;
                          }
                          else {
                            local_d48 = local_dd0;
                            local_d4c = local_db0;
                            local_d50 = local_db4;
                            local_d54 = local_db8;
                            local_d58 = local_df0;
                            in_stack_ffffffffffffe068 =
                                 (MLLinOp *)
                                 local_dd0->p
                                 [(long)(local_db0 - (local_dd0->begin).x) +
                                  (long)(local_db4 - (local_dd0->begin).y) * local_dd0->jstride +
                                  (long)(local_db8 - (local_dd0->begin).z) * local_dd0->kstride +
                                  (long)local_df0 * local_dd0->nstride];
                          }
                          local_d30 = local_de0;
                          local_d34 = local_db0;
                          local_d38 = local_db4;
                          local_d3c = local_db8;
                          local_d40 = local_df0;
                          local_9c4 = local_db8 + -1;
                          local_9b8 = local_dc0;
                          local_9bc = local_db0;
                          local_9c0 = local_db4;
                          local_9c8 = local_df0;
                          lVar10 = (long)(local_db0 - (int)local_dc0[4]) +
                                   (long)(local_db4 - *(int *)((long)local_dc0 + 0x24)) *
                                   local_dc0[1] +
                                   (long)(local_9c4 - (int)local_dc0[5]) * local_dc0[2] +
                                   (long)local_df0 * local_dc0[3];
                          *(double *)(*local_dc0 + lVar10 * 8) =
                               local_de8 * (double)in_stack_ffffffffffffe068 *
                               *(double *)
                                (*local_de0 +
                                ((long)(local_db0 - (int)local_de0[4]) +
                                 (long)(local_db4 - *(int *)((long)local_de0 + 0x24)) * local_de0[1]
                                 + (long)(local_db8 - (int)local_de0[5]) * local_de0[2] +
                                (long)local_df0 * local_de0[3]) * 8) +
                               *(double *)(*local_dc0 + lVar10 * 8);
                          local_df8 = in_stack_ffffffffffffe068;
                        }
                      }
                    }
                  }
                }
              }
            }
            if ((local_1572 & 1) != 0) {
              Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              ::operator[]((Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                            *)in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
              in_stack_ffffffffffffe060 =
                   (BndryCondLoc *)
                   std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::
                   operator*((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                             in_stack_ffffffffffffe060);
              local_d60 = FabArray<amrex::FArrayBox>::operator[]
                                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe060,
                                     (MFIter *)in_stack_ffffffffffffe058);
              local_d64 = local_196c * 3;
              local_198 = (local_d60->super_BaseFab<double>).dptr;
              local_1a0 = &(local_d60->super_BaseFab<double>).domain;
              local_1a4 = (local_d60->super_BaseFab<double>).nvar;
              local_14c = 0;
              local_178 = (local_1a0->smallend).vect[0];
              local_15c = 1;
              iStack_174 = (local_d60->super_BaseFab<double>).domain.smallend.vect[1];
              local_1c0.x = (local_1a0->smallend).vect[0];
              local_1c0.y = (local_1a0->smallend).vect[1];
              local_16c = 2;
              local_1c0.z = (local_d60->super_BaseFab<double>).domain.smallend.vect[2];
              local_f8 = &(local_d60->super_BaseFab<double>).domain.bigend;
              local_fc = 0;
              local_128 = local_f8->vect[0] + 1;
              local_108 = &(local_d60->super_BaseFab<double>).domain.bigend;
              local_10c = 1;
              iStack_124 = (local_d60->super_BaseFab<double>).domain.bigend.vect[1] + 1;
              local_118 = &(local_d60->super_BaseFab<double>).domain.bigend;
              local_11c = 2;
              local_1e0.z = (local_d60->super_BaseFab<double>).domain.bigend.vect[2] + 1;
              local_1e0.y = iStack_124;
              local_1e0.x = local_128;
              local_1cc._0_8_ = local_1e0._0_8_;
              local_1cc.z = local_1e0.z;
              local_1b0._0_8_ = local_1c0._0_8_;
              local_1b0.z = local_1c0.z;
              local_190._0_8_ = local_1c0._0_8_;
              local_190.z = local_1c0.z;
              local_180 = local_1a0;
              local_170 = local_1c0.z;
              local_168 = local_1a0;
              local_158 = local_1a0;
              local_148 = local_1a0;
              local_140._0_8_ = local_1e0._0_8_;
              local_140.z = local_1e0.z;
              local_130 = local_1a0;
              local_120 = local_1e0.z;
              Array4<const_double>::Array4(&local_da8,local_198,&local_1b0,&local_1cc,local_1a4);
              Array4<const_double>::Array4<const_double,_0>(&local_1c80,&local_da8,local_d64);
              local_1c40 = &local_1c80;
              Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                            *)in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
              pvVar9 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                                 ((array<amrex::LinOpBCType,_3UL> *)in_stack_ffffffffffffe060,
                                  (size_type)in_stack_ffffffffffffe058);
              if ((*pvVar9 == Robin) && ((local_1965 & 1) != 0)) {
                if (local_17b4 == 0) {
                  local_1480 = &local_181c;
                  local_374 = 0;
                  local_384 = 1;
                  local_394 = 2;
                  local_610 = &local_181c.bigend;
                  local_614 = 0;
                  local_620 = &local_181c.bigend;
                  local_624 = 1;
                  local_630 = &local_181c.bigend;
                  local_634 = 2;
                  for (local_1ccc = local_181c.smallend.vect[2];
                      local_1cd0 = local_181c.smallend.vect[1], local_1250 = local_1480,
                      local_390 = local_1480, local_380 = local_1480, local_370 = local_1480,
                      local_1ccc <= local_181c.bigend.vect[2]; local_1ccc = local_1ccc + 1) {
                    for (; local_1cd4 = local_181c.smallend.vect[0],
                        local_1cd0 <= local_181c.bigend.vect[1]; local_1cd0 = local_1cd0 + 1) {
                      for (; local_1cd4 <= local_181c.bigend.vect[0]; local_1cd4 = local_1cd4 + 1) {
                        local_9d0 = local_1c40;
                        local_9d4 = local_1cd4;
                        local_9d8 = local_1cd0;
                        local_9dc = local_1ccc;
                        local_9e0 = 2;
                        local_9e8 = local_1c40;
                        local_9ec = local_1cd4;
                        local_9f0 = local_1cd0;
                        local_9f4 = local_1ccc;
                        local_9f8 = 1;
                        local_a00 = local_1c40;
                        local_a04 = local_1cd4;
                        local_a08 = local_1cd0;
                        local_a0c = local_1ccc;
                        local_a10 = 0;
                        local_a1c = local_1cd4 + 1;
                        local_a20 = local_1cd0;
                        local_a24 = local_1ccc;
                        local_a28 = local_196c;
                        local_a18 = &local_17f8;
                        local_880 = local_1760;
                        local_884 = local_1cd4 + 1;
                        local_888 = local_1cd0;
                        local_88c = local_1ccc;
                        local_890 = local_196c;
                        lVar10 = (long)(local_884 - (int)local_1760[4]) +
                                 (long)(local_1cd0 - *(int *)((long)local_1760 + 0x24)) *
                                 local_1760[1] +
                                 (long)(local_1ccc - (int)local_1760[5]) * local_1760[2] +
                                 (long)local_196c * local_1760[3];
                        *(double *)(*local_1760 + lVar10 * 8) =
                             local_15f0 * local_15c0 * local_15c0 *
                             local_17f8.p
                             [(long)(local_a1c - local_17f8.begin.x) +
                              (local_1cd0 - local_17f8.begin.y) * local_17f8.jstride +
                              (local_1ccc - local_17f8.begin.z) * local_17f8.kstride +
                              local_196c * local_17f8.nstride] *
                             (local_1c40->p
                              [(long)(local_1cd4 - (local_1c40->begin).x) +
                               (long)(local_1cd0 - (local_1c40->begin).y) * local_1c40->jstride +
                               (long)(local_1ccc - (local_1c40->begin).z) * local_1c40->kstride +
                               local_1c40->nstride * 2] /
                             (local_1c40->p
                              [(long)(local_1cd4 - (local_1c40->begin).x) +
                               (long)(local_1cd0 - (local_1c40->begin).y) * local_1c40->jstride +
                               (long)(local_1ccc - (local_1c40->begin).z) * local_1c40->kstride +
                               local_1c40->nstride] * local_15c0 +
                             local_1c40->p
                             [(long)(local_1cd4 - (local_1c40->begin).x) +
                              (long)(local_1cd0 - (local_1c40->begin).y) * local_1c40->jstride +
                              (long)(local_1ccc - (local_1c40->begin).z) * local_1c40->kstride] *
                             0.5)) + *(double *)(*local_1760 + lVar10 * 8);
                      }
                    }
                  }
                }
                else if (local_17b4 == 1) {
                  local_14a8 = &local_181c;
                  local_344 = 0;
                  local_354 = 1;
                  local_364 = 2;
                  local_5e0 = &local_181c.bigend;
                  local_5e4 = 0;
                  local_5f0 = &local_181c.bigend;
                  local_5f4 = 1;
                  local_600 = &local_181c.bigend;
                  local_604 = 2;
                  for (local_1d2c = local_181c.smallend.vect[2];
                      local_1d30 = local_181c.smallend.vect[1], local_1278 = local_14a8,
                      local_360 = local_14a8, local_350 = local_14a8, local_340 = local_14a8,
                      local_1d2c <= local_181c.bigend.vect[2]; local_1d2c = local_1d2c + 1) {
                    for (; local_1d34 = local_181c.smallend.vect[0],
                        local_1d30 <= local_181c.bigend.vect[1]; local_1d30 = local_1d30 + 1) {
                      for (; local_1d34 <= local_181c.bigend.vect[0]; local_1d34 = local_1d34 + 1) {
                        local_a30 = local_1c40;
                        local_a34 = local_1d34;
                        local_a38 = local_1d30;
                        local_a3c = local_1d2c;
                        local_a40 = 2;
                        local_a48 = local_1c40;
                        local_a4c = local_1d34;
                        local_a50 = local_1d30;
                        local_a54 = local_1d2c;
                        local_a58 = 1;
                        local_a60 = local_1c40;
                        local_a64 = local_1d34;
                        local_a68 = local_1d30;
                        local_a6c = local_1d2c;
                        local_a70 = 0;
                        local_a7c = local_1d34;
                        local_a80 = local_1d30 + 1;
                        local_a84 = local_1d2c;
                        local_a88 = local_196c;
                        local_a78 = &local_17f8;
                        local_898 = local_1760;
                        local_89c = local_1d34;
                        local_8a0 = local_1d30 + 1;
                        local_8a4 = local_1d2c;
                        local_8a8 = local_196c;
                        lVar10 = (long)(local_1d34 - (int)local_1760[4]) +
                                 (long)(local_8a0 - *(int *)((long)local_1760 + 0x24)) *
                                 local_1760[1] +
                                 (long)(local_1d2c - (int)local_1760[5]) * local_1760[2] +
                                 (long)local_196c * local_1760[3];
                        *(double *)(*local_1760 + lVar10 * 8) =
                             local_15f0 * local_15c8 * local_15c8 *
                             local_17f8.p
                             [(long)(local_1d34 - local_17f8.begin.x) +
                              (local_a80 - local_17f8.begin.y) * local_17f8.jstride +
                              (local_1d2c - local_17f8.begin.z) * local_17f8.kstride +
                              local_196c * local_17f8.nstride] *
                             (local_1c40->p
                              [(long)(local_1d34 - (local_1c40->begin).x) +
                               (long)(local_1d30 - (local_1c40->begin).y) * local_1c40->jstride +
                               (long)(local_1d2c - (local_1c40->begin).z) * local_1c40->kstride +
                               local_1c40->nstride * 2] /
                             (local_1c40->p
                              [(long)(local_1d34 - (local_1c40->begin).x) +
                               (long)(local_1d30 - (local_1c40->begin).y) * local_1c40->jstride +
                               (long)(local_1d2c - (local_1c40->begin).z) * local_1c40->kstride +
                               local_1c40->nstride] * local_15c8 +
                             local_1c40->p
                             [(long)(local_1d34 - (local_1c40->begin).x) +
                              (long)(local_1d30 - (local_1c40->begin).y) * local_1c40->jstride +
                              (long)(local_1d2c - (local_1c40->begin).z) * local_1c40->kstride] *
                             0.5)) + *(double *)(*local_1760 + lVar10 * 8);
                      }
                    }
                  }
                }
                else {
                  local_14d0 = &local_181c;
                  local_314 = 0;
                  local_324 = 1;
                  local_334 = 2;
                  local_5b0 = &local_181c.bigend;
                  local_5b4 = 0;
                  local_5c0 = &local_181c.bigend;
                  local_5c4 = 1;
                  local_5d0 = &local_181c.bigend;
                  local_5d4 = 2;
                  for (local_1d8c = local_181c.smallend.vect[2];
                      local_1d90 = local_181c.smallend.vect[1], local_12a0 = local_14d0,
                      local_330 = local_14d0, local_320 = local_14d0, local_310 = local_14d0,
                      local_1d8c <= local_181c.bigend.vect[2]; local_1d8c = local_1d8c + 1) {
                    for (; local_1d94 = local_181c.smallend.vect[0],
                        local_1d90 <= local_181c.bigend.vect[1]; local_1d90 = local_1d90 + 1) {
                      for (; local_1d94 <= local_181c.bigend.vect[0]; local_1d94 = local_1d94 + 1) {
                        local_a90 = local_1c40;
                        local_a94 = local_1d94;
                        local_a98 = local_1d90;
                        local_a9c = local_1d8c;
                        local_aa0 = 2;
                        local_aa8 = local_1c40;
                        local_aac = local_1d94;
                        local_ab0 = local_1d90;
                        local_ab4 = local_1d8c;
                        local_ab8 = 1;
                        local_ac0 = local_1c40;
                        local_ac4 = local_1d94;
                        local_ac8 = local_1d90;
                        local_acc = local_1d8c;
                        local_ad0 = 0;
                        local_adc = local_1d94;
                        local_ae0 = local_1d90;
                        local_ae4 = local_1d8c + 1;
                        local_ae8 = local_196c;
                        local_ad8 = &local_17f8;
                        local_8b0 = local_1760;
                        local_8b4 = local_1d94;
                        local_8b8 = local_1d90;
                        local_8bc = local_1d8c + 1;
                        local_8c0 = local_196c;
                        lVar10 = (long)(local_1d94 - (int)local_1760[4]) +
                                 (long)(local_1d90 - *(int *)((long)local_1760 + 0x24)) *
                                 local_1760[1] +
                                 (long)(local_8bc - (int)local_1760[5]) * local_1760[2] +
                                 (long)local_196c * local_1760[3];
                        *(double *)(*local_1760 + lVar10 * 8) =
                             local_15f0 * local_15d0 * local_15d0 *
                             local_17f8.p
                             [(long)(local_1d94 - local_17f8.begin.x) +
                              (local_1d90 - local_17f8.begin.y) * local_17f8.jstride +
                              (local_ae4 - local_17f8.begin.z) * local_17f8.kstride +
                              local_196c * local_17f8.nstride] *
                             (local_1c40->p
                              [(long)(local_1d94 - (local_1c40->begin).x) +
                               (long)(local_1d90 - (local_1c40->begin).y) * local_1c40->jstride +
                               (long)(local_1d8c - (local_1c40->begin).z) * local_1c40->kstride +
                               local_1c40->nstride * 2] /
                             (local_1c40->p
                              [(long)(local_1d94 - (local_1c40->begin).x) +
                               (long)(local_1d90 - (local_1c40->begin).y) * local_1c40->jstride +
                               (long)(local_1d8c - (local_1c40->begin).z) * local_1c40->kstride +
                               local_1c40->nstride] * local_15d0 +
                             local_1c40->p
                             [(long)(local_1d94 - (local_1c40->begin).x) +
                              (long)(local_1d90 - (local_1c40->begin).y) * local_1c40->jstride +
                              (long)(local_1d8c - (local_1c40->begin).z) * local_1c40->kstride] *
                             0.5)) + *(double *)(*local_1760 + lVar10 * 8);
                      }
                    }
                  }
                }
              }
              Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                            *)in_stack_ffffffffffffe060,(size_type)in_stack_ffffffffffffe058);
              pvVar9 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                                 ((array<amrex::LinOpBCType,_3UL> *)in_stack_ffffffffffffe060,
                                  (size_type)in_stack_ffffffffffffe058);
              if ((*pvVar9 == Robin) && ((local_1966 & 1) != 0)) {
                if (local_17b4 == 0) {
                  local_14f8 = &local_1838;
                  local_2e4 = 0;
                  local_2f4 = 1;
                  local_304 = 2;
                  local_580 = &local_1838.bigend;
                  local_584 = 0;
                  local_590 = &local_1838.bigend;
                  local_594 = 1;
                  local_5a0 = &local_1838.bigend;
                  local_5a4 = 2;
                  for (local_1dec = local_1838.smallend.vect[2];
                      local_1df0 = local_1838.smallend.vect[1], local_12c8 = local_14f8,
                      local_300 = local_14f8, local_2f0 = local_14f8, local_2e0 = local_14f8,
                      local_1dec <= local_1838.bigend.vect[2]; local_1dec = local_1dec + 1) {
                    for (; local_1df4 = local_1838.smallend.vect[0],
                        local_1df0 <= local_1838.bigend.vect[1]; local_1df0 = local_1df0 + 1) {
                      for (; local_1df4 <= local_1838.bigend.vect[0]; local_1df4 = local_1df4 + 1) {
                        local_af0 = local_1c40;
                        local_af4 = local_1df4;
                        local_af8 = local_1df0;
                        local_afc = local_1dec;
                        local_b00 = 2;
                        local_b08 = local_1c40;
                        local_b0c = local_1df4;
                        local_b10 = local_1df0;
                        local_b14 = local_1dec;
                        local_b18 = 1;
                        local_b20 = local_1c40;
                        local_b24 = local_1df4;
                        local_b28 = local_1df0;
                        local_b2c = local_1dec;
                        local_b30 = 0;
                        local_b3c = local_1df4;
                        local_b40 = local_1df0;
                        local_b44 = local_1dec;
                        local_b48 = local_196c;
                        local_b38 = &local_17f8;
                        local_8c8 = local_1760;
                        local_8cc = local_1df4 + -1;
                        local_8d0 = local_1df0;
                        local_8d4 = local_1dec;
                        local_8d8 = local_196c;
                        lVar10 = (long)(local_8cc - (int)local_1760[4]) +
                                 (long)(local_1df0 - *(int *)((long)local_1760 + 0x24)) *
                                 local_1760[1] +
                                 (long)(local_1dec - (int)local_1760[5]) * local_1760[2] +
                                 (long)local_196c * local_1760[3];
                        *(double *)(*local_1760 + lVar10 * 8) =
                             local_15f0 * local_15c0 * local_15c0 *
                             local_17f8.p
                             [(long)(local_1df4 - local_17f8.begin.x) +
                              (local_1df0 - local_17f8.begin.y) * local_17f8.jstride +
                              (local_1dec - local_17f8.begin.z) * local_17f8.kstride +
                              local_196c * local_17f8.nstride] *
                             (local_1c40->p
                              [(long)(local_1df4 - (local_1c40->begin).x) +
                               (long)(local_1df0 - (local_1c40->begin).y) * local_1c40->jstride +
                               (long)(local_1dec - (local_1c40->begin).z) * local_1c40->kstride +
                               local_1c40->nstride * 2] /
                             (local_1c40->p
                              [(long)(local_1df4 - (local_1c40->begin).x) +
                               (long)(local_1df0 - (local_1c40->begin).y) * local_1c40->jstride +
                               (long)(local_1dec - (local_1c40->begin).z) * local_1c40->kstride +
                               local_1c40->nstride] * local_15c0 +
                             local_1c40->p
                             [(long)(local_1df4 - (local_1c40->begin).x) +
                              (long)(local_1df0 - (local_1c40->begin).y) * local_1c40->jstride +
                              (long)(local_1dec - (local_1c40->begin).z) * local_1c40->kstride] *
                             0.5)) + *(double *)(*local_1760 + lVar10 * 8);
                      }
                    }
                  }
                }
                else if (local_17b4 == 1) {
                  local_1520 = &local_1838;
                  local_2b4 = 0;
                  local_2c4 = 1;
                  local_2d4 = 2;
                  local_550 = &local_1838.bigend;
                  local_554 = 0;
                  local_560 = &local_1838.bigend;
                  local_564 = 1;
                  local_570 = &local_1838.bigend;
                  local_574 = 2;
                  for (local_1e4c = local_1838.smallend.vect[2];
                      local_1e50 = local_1838.smallend.vect[1], local_12f0 = local_1520,
                      local_2d0 = local_1520, local_2c0 = local_1520, local_2b0 = local_1520,
                      local_1e4c <= local_1838.bigend.vect[2]; local_1e4c = local_1e4c + 1) {
                    for (; local_1e54 = local_1838.smallend.vect[0],
                        local_1e50 <= local_1838.bigend.vect[1]; local_1e50 = local_1e50 + 1) {
                      for (; local_1e54 <= local_1838.bigend.vect[0]; local_1e54 = local_1e54 + 1) {
                        local_b50 = local_1c40;
                        local_b54 = local_1e54;
                        local_b58 = local_1e50;
                        local_b5c = local_1e4c;
                        local_b60 = 2;
                        local_b68 = local_1c40;
                        local_b6c = local_1e54;
                        local_b70 = local_1e50;
                        local_b74 = local_1e4c;
                        local_b78 = 1;
                        local_b80 = local_1c40;
                        local_b84 = local_1e54;
                        local_b88 = local_1e50;
                        local_b8c = local_1e4c;
                        local_b90 = 0;
                        local_b9c = local_1e54;
                        local_ba0 = local_1e50;
                        local_ba4 = local_1e4c;
                        local_ba8 = local_196c;
                        local_b98 = &local_17f8;
                        local_8e0 = local_1760;
                        local_8e4 = local_1e54;
                        local_8e8 = local_1e50 + -1;
                        local_8ec = local_1e4c;
                        local_8f0 = local_196c;
                        lVar10 = (long)(local_1e54 - (int)local_1760[4]) +
                                 (long)(local_8e8 - *(int *)((long)local_1760 + 0x24)) *
                                 local_1760[1] +
                                 (long)(local_1e4c - (int)local_1760[5]) * local_1760[2] +
                                 (long)local_196c * local_1760[3];
                        *(double *)(*local_1760 + lVar10 * 8) =
                             local_15f0 * local_15c8 * local_15c8 *
                             local_17f8.p
                             [(long)(local_1e54 - local_17f8.begin.x) +
                              (local_1e50 - local_17f8.begin.y) * local_17f8.jstride +
                              (local_1e4c - local_17f8.begin.z) * local_17f8.kstride +
                              local_196c * local_17f8.nstride] *
                             (local_1c40->p
                              [(long)(local_1e54 - (local_1c40->begin).x) +
                               (long)(local_1e50 - (local_1c40->begin).y) * local_1c40->jstride +
                               (long)(local_1e4c - (local_1c40->begin).z) * local_1c40->kstride +
                               local_1c40->nstride * 2] /
                             (local_1c40->p
                              [(long)(local_1e54 - (local_1c40->begin).x) +
                               (long)(local_1e50 - (local_1c40->begin).y) * local_1c40->jstride +
                               (long)(local_1e4c - (local_1c40->begin).z) * local_1c40->kstride +
                               local_1c40->nstride] * local_15c8 +
                             local_1c40->p
                             [(long)(local_1e54 - (local_1c40->begin).x) +
                              (long)(local_1e50 - (local_1c40->begin).y) * local_1c40->jstride +
                              (long)(local_1e4c - (local_1c40->begin).z) * local_1c40->kstride] *
                             0.5)) + *(double *)(*local_1760 + lVar10 * 8);
                      }
                    }
                  }
                }
                else {
                  local_1548 = &local_1838;
                  local_284 = 0;
                  local_294 = 1;
                  local_2a4 = 2;
                  local_520 = &local_1838.bigend;
                  local_524 = 0;
                  local_530 = &local_1838.bigend;
                  local_534 = 1;
                  local_540 = &local_1838.bigend;
                  local_544 = 2;
                  for (local_1eac = local_1838.smallend.vect[2];
                      local_1eb0 = local_1838.smallend.vect[1], local_1318 = local_1548,
                      local_2a0 = local_1548, local_290 = local_1548, local_280 = local_1548,
                      local_1eac <= local_1838.bigend.vect[2]; local_1eac = local_1eac + 1) {
                    for (; local_1eb4 = local_1838.smallend.vect[0],
                        local_1eb0 <= local_1838.bigend.vect[1]; local_1eb0 = local_1eb0 + 1) {
                      for (; local_1eb4 <= local_1838.bigend.vect[0]; local_1eb4 = local_1eb4 + 1) {
                        local_bb0 = local_1c40;
                        local_bb4 = local_1eb4;
                        local_bb8 = local_1eb0;
                        local_bbc = local_1eac;
                        local_bc0 = 2;
                        local_bc8 = local_1c40;
                        local_bcc = local_1eb4;
                        local_bd0 = local_1eb0;
                        local_bd4 = local_1eac;
                        local_bd8 = 1;
                        local_be0 = local_1c40;
                        local_be4 = local_1eb4;
                        local_be8 = local_1eb0;
                        local_bec = local_1eac;
                        local_bf0 = 0;
                        local_bfc = local_1eb4;
                        local_c00 = local_1eb0;
                        local_c04 = local_1eac;
                        local_c08 = local_196c;
                        local_bf8 = &local_17f8;
                        local_8f8 = local_1760;
                        local_8fc = local_1eb4;
                        local_900 = local_1eb0;
                        local_904 = local_1eac + -1;
                        local_908 = local_196c;
                        lVar10 = (long)(local_1eb4 - (int)local_1760[4]) +
                                 (long)(local_1eb0 - *(int *)((long)local_1760 + 0x24)) *
                                 local_1760[1] +
                                 (long)(local_904 - (int)local_1760[5]) * local_1760[2] +
                                 (long)local_196c * local_1760[3];
                        *(double *)(*local_1760 + lVar10 * 8) =
                             local_15f0 * local_15d0 * local_15d0 *
                             local_17f8.p
                             [(long)(local_1eb4 - local_17f8.begin.x) +
                              (local_1eb0 - local_17f8.begin.y) * local_17f8.jstride +
                              (local_1eac - local_17f8.begin.z) * local_17f8.kstride +
                              local_196c * local_17f8.nstride] *
                             (local_1c40->p
                              [(long)(local_1eb4 - (local_1c40->begin).x) +
                               (long)(local_1eb0 - (local_1c40->begin).y) * local_1c40->jstride +
                               (long)(local_1eac - (local_1c40->begin).z) * local_1c40->kstride +
                               local_1c40->nstride * 2] /
                             (local_1c40->p
                              [(long)(local_1eb4 - (local_1c40->begin).x) +
                               (long)(local_1eb0 - (local_1c40->begin).y) * local_1c40->jstride +
                               (long)(local_1eac - (local_1c40->begin).z) * local_1c40->kstride +
                               local_1c40->nstride] * local_15d0 +
                             local_1c40->p
                             [(long)(local_1eb4 - (local_1c40->begin).x) +
                              (long)(local_1eb0 - (local_1c40->begin).y) * local_1c40->jstride +
                              (long)(local_1eac - (local_1c40->begin).z) * local_1c40->kstride] *
                             0.5)) + *(double *)(*local_1760 + lVar10 * 8);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      MFIter::operator++(&local_1730);
    }
    MFIter::~MFIter((MFIter *)in_stack_ffffffffffffe060);
    FArrayBox::~FArrayBox((FArrayBox *)0x169f9ac);
  }
  return;
}

Assistant:

void
MLCellABecLap::applyInhomogNeumannTerm (int amrlev, Any& a_rhs) const
{
    bool has_inhomog_neumann = hasInhomogNeumannBC();
    bool has_robin = hasRobinBC();

    if (!has_inhomog_neumann && !has_robin) return;

    AMREX_ASSERT(a_rhs.is<MultiFab>());
    MultiFab& rhs = a_rhs.get<MultiFab>();

    int ncomp = getNComp();
    const int mglev = 0;

    const auto problo = m_geom[amrlev][mglev].ProbLoArray();
    const auto probhi = m_geom[amrlev][mglev].ProbHiArray();
    amrex::ignore_unused(probhi);
    const Real dxi = m_geom[amrlev][mglev].InvCellSize(0);
    const Real dyi = (AMREX_SPACEDIM >= 2) ? m_geom[amrlev][mglev].InvCellSize(1) : Real(1.0);
    const Real dzi = (AMREX_SPACEDIM == 3) ? m_geom[amrlev][mglev].InvCellSize(2) : Real(1.0);
    const Real xlo = problo[0];
    const Real dx = m_geom[amrlev][mglev].CellSize(0);
    const Box& domain = m_geom[amrlev][mglev].Domain();

    const Real beta = getBScalar();
    Array<MultiFab const*, AMREX_SPACEDIM> const& bcoef = getBCoeffs(amrlev,mglev);
    FArrayBox foo(Box(IntVect(0),IntVect(1)));
    bool has_bcoef = (bcoef[0] != nullptr);

    const auto& maskvals = m_maskvals[amrlev][mglev];
    const auto& bcondloc = *m_bcondloc[amrlev][mglev];
    const auto& bndry = *m_bndry_sol[amrlev];

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(rhs, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& vbx = mfi.validbox();
        Array4<Real> const& rhsfab = rhs.array(mfi);

        const auto & bdlv = bcondloc.bndryLocs(mfi);
        const auto & bdcv = bcondloc.bndryConds(mfi);

        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            Array4<Real const> const bfab = (has_bcoef)
                ? bcoef[idim]->const_array(mfi) : foo.const_array();
            const Orientation olo(idim,Orientation::low);
            const Orientation ohi(idim,Orientation::high);
            const Box blo = amrex::adjCellLo(vbx, idim);
            const Box bhi = amrex::adjCellHi(vbx, idim);
            const auto& mlo = maskvals[olo].array(mfi);
            const auto& mhi = maskvals[ohi].array(mfi);
            const auto& bvlo = bndry.bndryValues(olo).array(mfi);
            const auto& bvhi = bndry.bndryValues(ohi).array(mfi);
            bool outside_domain_lo = !(domain.contains(blo));
            bool outside_domain_hi = !(domain.contains(bhi));
            if ((!outside_domain_lo) && (!outside_domain_hi)) continue;
            for (int icomp = 0; icomp < ncomp; ++icomp) {
                const BoundCond bctlo = bdcv[icomp][olo];
                const BoundCond bcthi = bdcv[icomp][ohi];
                const Real bcllo = bdlv[icomp][olo];
                const Real bclhi = bdlv[icomp][ohi];
                if (m_lobc_orig[icomp][idim] == LinOpBCType::inhomogNeumann && outside_domain_lo)
                {
                    if (idim == 0) {
                        Real fac = beta*dxi;
                        if (m_has_metric_term && !has_bcoef) {
#if (AMREX_SPACEDIM == 1)
                            fac *= problo[0]*problo[0];
#elif (AMREX_SPACEDIM == 2)
                            fac *= problo[0];
#endif
                        }
                        AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                        {
                            mllinop_apply_innu_xlo(i,j,k, rhsfab, mlo, bfab,
                                                   bctlo, bcllo, bvlo,
                                                   fac, has_bcoef, icomp);
                        });
                    } else if (idim == 1) {
                        Real fac = beta*dyi;
                        if (m_has_metric_term && !has_bcoef) {
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                mllinop_apply_innu_ylo_m(i,j,k, rhsfab, mlo,
                                                         bctlo, bcllo, bvlo,
                                                         fac, xlo, dx, icomp);
                            });
                        }
                        else {
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                mllinop_apply_innu_ylo(i,j,k, rhsfab, mlo, bfab,
                                                       bctlo, bcllo, bvlo,
                                                       fac, has_bcoef, icomp);
                            });
                        }
                    } else {
                        Real fac = beta*dzi;
                        AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                        {
                            mllinop_apply_innu_zlo(i,j,k, rhsfab, mlo, bfab,
                                                   bctlo, bcllo, bvlo,
                                                   fac, has_bcoef, icomp);
                        });
                    }
                }
                if (m_hibc_orig[icomp][idim] == LinOpBCType::inhomogNeumann && outside_domain_hi)
                {
                    if (idim == 0) {
                        Real fac = beta*dxi;
                        if (m_has_metric_term && !has_bcoef) {
#if (AMREX_SPACEDIM == 1)
                            fac *= probhi[0]*probhi[0];
#elif (AMREX_SPACEDIM == 2)
                            fac *= probhi[0];
#endif
                        }
                        AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                        {
                            mllinop_apply_innu_xhi(i,j,k, rhsfab, mhi, bfab,
                                                   bcthi, bclhi, bvhi,
                                                   fac, has_bcoef, icomp);
                        });
                    } else if (idim == 1) {
                        Real fac = beta*dyi;
                        if (m_has_metric_term && !has_bcoef) {
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                mllinop_apply_innu_yhi_m(i,j,k, rhsfab, mhi,
                                                         bcthi, bclhi, bvhi,
                                                         fac, xlo, dx, icomp);
                            });
                        } else {
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                mllinop_apply_innu_yhi(i,j,k, rhsfab, mhi, bfab,
                                                       bcthi, bclhi, bvhi,
                                                       fac, has_bcoef, icomp);
                            });
                        }
                    } else {
                        Real fac = beta*dzi;
                        AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                        {
                            mllinop_apply_innu_zhi(i,j,k, rhsfab, mhi, bfab,
                                                   bcthi, bclhi, bvhi,
                                                   fac, has_bcoef, icomp);
                        });
                    }
                }

                if (has_robin) {
                    // For Robin BC, see comments in AMReX_MLABecLaplacian.cpp above
                    // function applyRobinBCTermsCoeffs.
                    Array4<Real const> const& rbc = (*m_robin_bcval[amrlev])[mfi].const_array(icomp*3);
                    if (m_lobc_orig[icomp][idim] == LinOpBCType::Robin && outside_domain_lo)
                    {
                        if (idim == 0) {
                            Real fac = beta*dxi*dxi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dxi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i+1,j,k,icomp) += fac*bfab(i+1,j,k,icomp)*A;
                            });
                        } else if (idim == 1) {
                            Real fac = beta*dyi*dyi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dyi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i,j+1,k,icomp) += fac*bfab(i,j+1,k,icomp)*A;
                            });
                        } else {
                            Real fac = beta*dzi*dzi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dzi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i,j,k+1,icomp) += fac*bfab(i,j,k+1,icomp)*A;
                            });
                        }
                    }
                    if (m_hibc_orig[icomp][idim] == LinOpBCType::Robin && outside_domain_hi)
                    {
                        if (idim == 0) {
                            Real fac = beta*dxi*dxi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dxi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i-1,j,k,icomp) += fac*bfab(i,j,k,icomp)*A;
                            });
                        } else if (idim == 1) {
                            Real fac = beta*dyi*dyi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dyi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i,j-1,k,icomp) += fac*bfab(i,j,k,icomp)*A;
                            });
                        } else {
                            Real fac = beta*dzi*dzi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real A = rbc(i,j,k,2)
                                    / (rbc(i,j,k,1)*dzi + rbc(i,j,k,0)*Real(0.5));
                                rhsfab(i,j,k-1,icomp) += fac*bfab(i,j,k,icomp)*A;
                            });
                        }
                    }
                }
            }
        }

    }
}